

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx512::CurveNvIntersectorK<8,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  long lVar48;
  undefined1 auVar49 [12];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  byte bVar55;
  byte bVar56;
  ulong uVar57;
  byte bVar58;
  byte bVar59;
  ulong uVar60;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  byte bVar61;
  byte bVar62;
  byte bVar63;
  uint uVar64;
  ulong uVar65;
  int iVar66;
  long lVar67;
  undefined1 uVar68;
  bool bVar69;
  undefined1 uVar70;
  bool bVar71;
  ulong uVar72;
  uint uVar73;
  uint uVar138;
  uint uVar139;
  uint uVar141;
  uint uVar142;
  uint uVar143;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  uint uVar140;
  uint uVar144;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar82 [16];
  undefined1 auVar137 [64];
  float pp;
  float fVar145;
  undefined1 auVar147 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar146;
  undefined1 auVar153 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar166;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar167;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar207;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [64];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined4 uVar224;
  float fVar225;
  float fVar232;
  float fVar233;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar234;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar235;
  float fVar236;
  undefined1 auVar237 [32];
  float fVar239;
  undefined1 auVar238 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar243;
  undefined1 auVar242 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_9f0;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  undefined1 local_870 [16];
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [64];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte local_1a0 [32];
  undefined1 auStack_180 [32];
  float local_160 [2];
  int local_158 [74];
  
  PVar1 = prim[1];
  uVar57 = (ulong)(byte)PVar1;
  lVar48 = uVar57 * 0x19;
  fVar225 = *(float *)(prim + lVar48 + 0x12);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar80 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar82 = vsubps_avx(auVar17,*(undefined1 (*) [16])(prim + lVar48 + 6));
  fVar207 = fVar225 * auVar82._0_4_;
  fVar145 = fVar225 * auVar80._0_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar57 * 4 + 6);
  auVar88 = vpmovsxbd_avx2(auVar17);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar57 * 5 + 6);
  auVar87 = vpmovsxbd_avx2(auVar18);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar57 * 6 + 6);
  auVar89 = vpmovsxbd_avx2(auVar76);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar57 * 0xb + 6);
  auVar90 = vpmovsxbd_avx2(auVar77);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6);
  auVar91 = vpmovsxbd_avx2(auVar74);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + (uint)(byte)PVar1 * 0xc + uVar57 + 6);
  auVar92 = vpmovsxbd_avx2(auVar78);
  auVar92 = vcvtdq2ps_avx(auVar92);
  uVar65 = (ulong)(uint)((int)(uVar57 * 9) * 2);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar65 + 6);
  auVar93 = vpmovsxbd_avx2(auVar81);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar65 + uVar57 + 6);
  auVar96 = vpmovsxbd_avx2(auVar75);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar94 = vcvtdq2ps_avx(auVar96);
  uVar72 = (ulong)(uint)((int)(uVar57 * 5) << 2);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar72 + 6);
  auVar85 = vpmovsxbd_avx2(auVar79);
  auVar95 = vcvtdq2ps_avx(auVar85);
  auVar103._4_4_ = fVar145;
  auVar103._0_4_ = fVar145;
  auVar103._8_4_ = fVar145;
  auVar103._12_4_ = fVar145;
  auVar103._16_4_ = fVar145;
  auVar103._20_4_ = fVar145;
  auVar103._24_4_ = fVar145;
  auVar103._28_4_ = fVar145;
  auVar105._8_4_ = 1;
  auVar105._0_8_ = 0x100000001;
  auVar105._12_4_ = 1;
  auVar105._16_4_ = 1;
  auVar105._20_4_ = 1;
  auVar105._24_4_ = 1;
  auVar105._28_4_ = 1;
  auVar97 = ZEXT1632(CONCAT412(fVar225 * auVar80._12_4_,
                               CONCAT48(fVar225 * auVar80._8_4_,
                                        CONCAT44(fVar225 * auVar80._4_4_,fVar145))));
  auVar86 = vpermps_avx2(auVar105,auVar97);
  auVar83 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar84 = vpermps_avx512vl(auVar83,auVar97);
  fVar145 = auVar84._0_4_;
  fVar232 = auVar84._4_4_;
  auVar97._4_4_ = fVar232 * auVar89._4_4_;
  auVar97._0_4_ = fVar145 * auVar89._0_4_;
  fVar233 = auVar84._8_4_;
  auVar97._8_4_ = fVar233 * auVar89._8_4_;
  fVar234 = auVar84._12_4_;
  auVar97._12_4_ = fVar234 * auVar89._12_4_;
  fVar239 = auVar84._16_4_;
  auVar97._16_4_ = fVar239 * auVar89._16_4_;
  fVar146 = auVar84._20_4_;
  auVar97._20_4_ = fVar146 * auVar89._20_4_;
  fVar235 = auVar84._24_4_;
  auVar97._24_4_ = fVar235 * auVar89._24_4_;
  auVar97._28_4_ = auVar96._28_4_;
  auVar96._4_4_ = auVar92._4_4_ * fVar232;
  auVar96._0_4_ = auVar92._0_4_ * fVar145;
  auVar96._8_4_ = auVar92._8_4_ * fVar233;
  auVar96._12_4_ = auVar92._12_4_ * fVar234;
  auVar96._16_4_ = auVar92._16_4_ * fVar239;
  auVar96._20_4_ = auVar92._20_4_ * fVar146;
  auVar96._24_4_ = auVar92._24_4_ * fVar235;
  auVar96._28_4_ = auVar85._28_4_;
  auVar85._4_4_ = auVar95._4_4_ * fVar232;
  auVar85._0_4_ = auVar95._0_4_ * fVar145;
  auVar85._8_4_ = auVar95._8_4_ * fVar233;
  auVar85._12_4_ = auVar95._12_4_ * fVar234;
  auVar85._16_4_ = auVar95._16_4_ * fVar239;
  auVar85._20_4_ = auVar95._20_4_ * fVar146;
  auVar85._24_4_ = auVar95._24_4_ * fVar235;
  auVar85._28_4_ = auVar84._28_4_;
  auVar17 = vfmadd231ps_fma(auVar97,auVar86,auVar87);
  auVar18 = vfmadd231ps_fma(auVar96,auVar86,auVar91);
  auVar76 = vfmadd231ps_fma(auVar85,auVar94,auVar86);
  auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar103,auVar88);
  auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar103,auVar90);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar93,auVar103);
  auVar104._4_4_ = fVar207;
  auVar104._0_4_ = fVar207;
  auVar104._8_4_ = fVar207;
  auVar104._12_4_ = fVar207;
  auVar104._16_4_ = fVar207;
  auVar104._20_4_ = fVar207;
  auVar104._24_4_ = fVar207;
  auVar104._28_4_ = fVar207;
  auVar85 = ZEXT1632(CONCAT412(fVar225 * auVar82._12_4_,
                               CONCAT48(fVar225 * auVar82._8_4_,
                                        CONCAT44(fVar225 * auVar82._4_4_,fVar207))));
  auVar96 = vpermps_avx2(auVar105,auVar85);
  auVar85 = vpermps_avx512vl(auVar83,auVar85);
  auVar86 = vmulps_avx512vl(auVar85,auVar89);
  auVar99._0_4_ = auVar85._0_4_ * auVar92._0_4_;
  auVar99._4_4_ = auVar85._4_4_ * auVar92._4_4_;
  auVar99._8_4_ = auVar85._8_4_ * auVar92._8_4_;
  auVar99._12_4_ = auVar85._12_4_ * auVar92._12_4_;
  auVar99._16_4_ = auVar85._16_4_ * auVar92._16_4_;
  auVar99._20_4_ = auVar85._20_4_ * auVar92._20_4_;
  auVar99._24_4_ = auVar85._24_4_ * auVar92._24_4_;
  auVar99._28_4_ = 0;
  auVar92._4_4_ = auVar85._4_4_ * auVar95._4_4_;
  auVar92._0_4_ = auVar85._0_4_ * auVar95._0_4_;
  auVar92._8_4_ = auVar85._8_4_ * auVar95._8_4_;
  auVar92._12_4_ = auVar85._12_4_ * auVar95._12_4_;
  auVar92._16_4_ = auVar85._16_4_ * auVar95._16_4_;
  auVar92._20_4_ = auVar85._20_4_ * auVar95._20_4_;
  auVar92._24_4_ = auVar85._24_4_ * auVar95._24_4_;
  auVar92._28_4_ = auVar89._28_4_;
  auVar87 = vfmadd231ps_avx512vl(auVar86,auVar96,auVar87);
  auVar77 = vfmadd231ps_fma(auVar99,auVar96,auVar91);
  auVar74 = vfmadd231ps_fma(auVar92,auVar96,auVar94);
  auVar87 = vfmadd231ps_avx512vl(auVar87,auVar104,auVar88);
  auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar104,auVar90);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar104,auVar93);
  auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar247 = ZEXT3264(auVar88);
  vandps_avx512vl(ZEXT1632(auVar17),auVar88);
  auVar101._8_4_ = 0x219392ef;
  auVar101._0_8_ = 0x219392ef219392ef;
  auVar101._12_4_ = 0x219392ef;
  auVar101._16_4_ = 0x219392ef;
  auVar101._20_4_ = 0x219392ef;
  auVar101._24_4_ = 0x219392ef;
  auVar101._28_4_ = 0x219392ef;
  uVar65 = vcmpps_avx512vl(auVar88,auVar101,1);
  bVar71 = (bool)((byte)uVar65 & 1);
  auVar86._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar17._0_4_;
  bVar71 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar17._4_4_;
  bVar71 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar17._8_4_;
  bVar71 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar17._12_4_;
  auVar86._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * 0x219392ef;
  auVar86._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * 0x219392ef;
  auVar86._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * 0x219392ef;
  auVar86._28_4_ = (uint)(byte)(uVar65 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar18),auVar88);
  uVar65 = vcmpps_avx512vl(auVar86,auVar101,1);
  bVar71 = (bool)((byte)uVar65 & 1);
  auVar83._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar18._0_4_;
  bVar71 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar18._4_4_;
  bVar71 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar18._8_4_;
  bVar71 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar18._12_4_;
  auVar83._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * 0x219392ef;
  auVar83._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * 0x219392ef;
  auVar83._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * 0x219392ef;
  auVar83._28_4_ = (uint)(byte)(uVar65 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar76),auVar88);
  uVar65 = vcmpps_avx512vl(auVar83,auVar101,1);
  bVar71 = (bool)((byte)uVar65 & 1);
  auVar88._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar76._0_4_;
  bVar71 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar76._4_4_;
  bVar71 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar76._8_4_;
  bVar71 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar76._12_4_;
  auVar88._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * 0x219392ef;
  auVar88._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * 0x219392ef;
  auVar88._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * 0x219392ef;
  auVar88._28_4_ = (uint)(byte)(uVar65 >> 7) * 0x219392ef;
  auVar89 = vrcp14ps_avx512vl(auVar86);
  auVar102._8_4_ = 0x3f800000;
  auVar102._0_8_ = &DAT_3f8000003f800000;
  auVar102._12_4_ = 0x3f800000;
  auVar102._16_4_ = 0x3f800000;
  auVar102._20_4_ = 0x3f800000;
  auVar102._24_4_ = 0x3f800000;
  auVar102._28_4_ = 0x3f800000;
  auVar17 = vfnmadd213ps_fma(auVar86,auVar89,auVar102);
  auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar83);
  auVar18 = vfnmadd213ps_fma(auVar83,auVar89,auVar102);
  auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar88);
  auVar76 = vfnmadd213ps_fma(auVar88,auVar89,auVar102);
  auVar76 = vfmadd132ps_fma(ZEXT1632(auVar76),auVar89,auVar89);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar57 * 7 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vsubps_avx512vl(auVar88,auVar87);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar57 * 9 + 6));
  auVar93._4_4_ = auVar17._4_4_ * auVar89._4_4_;
  auVar93._0_4_ = auVar17._0_4_ * auVar89._0_4_;
  auVar93._8_4_ = auVar17._8_4_ * auVar89._8_4_;
  auVar93._12_4_ = auVar17._12_4_ * auVar89._12_4_;
  auVar93._16_4_ = auVar89._16_4_ * 0.0;
  auVar93._20_4_ = auVar89._20_4_ * 0.0;
  auVar93._24_4_ = auVar89._24_4_ * 0.0;
  auVar93._28_4_ = auVar89._28_4_;
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx512vl(auVar88,auVar87);
  auVar100._0_4_ = auVar17._0_4_ * auVar88._0_4_;
  auVar100._4_4_ = auVar17._4_4_ * auVar88._4_4_;
  auVar100._8_4_ = auVar17._8_4_ * auVar88._8_4_;
  auVar100._12_4_ = auVar17._12_4_ * auVar88._12_4_;
  auVar100._16_4_ = auVar88._16_4_ * 0.0;
  auVar100._20_4_ = auVar88._20_4_ * 0.0;
  auVar100._24_4_ = auVar88._24_4_ * 0.0;
  auVar100._28_4_ = 0;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar1 * 0x10 + 6));
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar1 * 0x10 + uVar57 * -2 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar77));
  auVar94._4_4_ = auVar18._4_4_ * auVar88._4_4_;
  auVar94._0_4_ = auVar18._0_4_ * auVar88._0_4_;
  auVar94._8_4_ = auVar18._8_4_ * auVar88._8_4_;
  auVar94._12_4_ = auVar18._12_4_ * auVar88._12_4_;
  auVar94._16_4_ = auVar88._16_4_ * 0.0;
  auVar94._20_4_ = auVar88._20_4_ * 0.0;
  auVar94._24_4_ = auVar88._24_4_ * 0.0;
  auVar94._28_4_ = auVar88._28_4_;
  auVar88 = vcvtdq2ps_avx(auVar87);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar77));
  auVar98._0_4_ = auVar18._0_4_ * auVar88._0_4_;
  auVar98._4_4_ = auVar18._4_4_ * auVar88._4_4_;
  auVar98._8_4_ = auVar18._8_4_ * auVar88._8_4_;
  auVar98._12_4_ = auVar18._12_4_ * auVar88._12_4_;
  auVar98._16_4_ = auVar88._16_4_ * 0.0;
  auVar98._20_4_ = auVar88._20_4_ * 0.0;
  auVar98._24_4_ = auVar88._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 + uVar57 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar74));
  auVar95._4_4_ = auVar88._4_4_ * auVar76._4_4_;
  auVar95._0_4_ = auVar88._0_4_ * auVar76._0_4_;
  auVar95._8_4_ = auVar88._8_4_ * auVar76._8_4_;
  auVar95._12_4_ = auVar88._12_4_ * auVar76._12_4_;
  auVar95._16_4_ = auVar88._16_4_ * 0.0;
  auVar95._20_4_ = auVar88._20_4_ * 0.0;
  auVar95._24_4_ = auVar88._24_4_ * 0.0;
  auVar95._28_4_ = auVar88._28_4_;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar57 * 0x17 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar74));
  auVar84._0_4_ = auVar76._0_4_ * auVar88._0_4_;
  auVar84._4_4_ = auVar76._4_4_ * auVar88._4_4_;
  auVar84._8_4_ = auVar76._8_4_ * auVar88._8_4_;
  auVar84._12_4_ = auVar76._12_4_ * auVar88._12_4_;
  auVar84._16_4_ = auVar88._16_4_ * 0.0;
  auVar84._20_4_ = auVar88._20_4_ * 0.0;
  auVar84._24_4_ = auVar88._24_4_ * 0.0;
  auVar84._28_4_ = 0;
  auVar88 = vpminsd_avx2(auVar93,auVar100);
  auVar87 = vpminsd_avx2(auVar94,auVar98);
  auVar88 = vmaxps_avx(auVar88,auVar87);
  auVar87 = vpminsd_avx2(auVar95,auVar84);
  uVar224 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar89._4_4_ = uVar224;
  auVar89._0_4_ = uVar224;
  auVar89._8_4_ = uVar224;
  auVar89._12_4_ = uVar224;
  auVar89._16_4_ = uVar224;
  auVar89._20_4_ = uVar224;
  auVar89._24_4_ = uVar224;
  auVar89._28_4_ = uVar224;
  auVar87 = vmaxps_avx512vl(auVar87,auVar89);
  auVar88 = vmaxps_avx(auVar88,auVar87);
  auVar87._8_4_ = 0x3f7ffffa;
  auVar87._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar87._12_4_ = 0x3f7ffffa;
  auVar87._16_4_ = 0x3f7ffffa;
  auVar87._20_4_ = 0x3f7ffffa;
  auVar87._24_4_ = 0x3f7ffffa;
  auVar87._28_4_ = 0x3f7ffffa;
  local_580 = vmulps_avx512vl(auVar88,auVar87);
  auVar88 = vpmaxsd_avx2(auVar93,auVar100);
  auVar87 = vpmaxsd_avx2(auVar94,auVar98);
  auVar88 = vminps_avx(auVar88,auVar87);
  auVar87 = vpmaxsd_avx2(auVar95,auVar84);
  uVar224 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar90._4_4_ = uVar224;
  auVar90._0_4_ = uVar224;
  auVar90._8_4_ = uVar224;
  auVar90._12_4_ = uVar224;
  auVar90._16_4_ = uVar224;
  auVar90._20_4_ = uVar224;
  auVar90._24_4_ = uVar224;
  auVar90._28_4_ = uVar224;
  auVar87 = vminps_avx512vl(auVar87,auVar90);
  auVar88 = vminps_avx(auVar88,auVar87);
  auVar91._8_4_ = 0x3f800003;
  auVar91._0_8_ = 0x3f8000033f800003;
  auVar91._12_4_ = 0x3f800003;
  auVar91._16_4_ = 0x3f800003;
  auVar91._20_4_ = 0x3f800003;
  auVar91._24_4_ = 0x3f800003;
  auVar91._28_4_ = 0x3f800003;
  auVar88 = vmulps_avx512vl(auVar88,auVar91);
  auVar87 = vpbroadcastd_avx512vl();
  uVar22 = vpcmpgtd_avx512vl(auVar87,_DAT_0205a920);
  uVar20 = vcmpps_avx512vl(local_580,auVar88,2);
  bVar69 = (byte)((byte)uVar20 & (byte)uVar22) == 0;
  bVar71 = !bVar69;
  if (bVar69) {
    return bVar71;
  }
  uVar65 = (ulong)(byte)((byte)uVar20 & (byte)uVar22);
  auVar165 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar165);
LAB_01d143da:
  iVar66 = 0;
  for (uVar57 = uVar65; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
    iVar66 = iVar66 + 1;
  }
  uVar65 = uVar65 - 1 & uVar65;
  uVar57 = (ulong)(uint)(iVar66 << 6);
  auVar17 = *(undefined1 (*) [16])(prim + uVar57 + lVar48 + 0x16);
  if (uVar65 != 0) {
    uVar60 = uVar65 - 1 & uVar65;
    for (uVar72 = uVar65; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
    }
    if (uVar60 != 0) {
      for (; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar18 = *(undefined1 (*) [16])(prim + uVar57 + lVar48 + 0x26);
  auVar76 = *(undefined1 (*) [16])(prim + uVar57 + lVar48 + 0x36);
  auVar77 = *(undefined1 (*) [16])(prim + uVar57 + lVar48 + 0x46);
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar78 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar64 = *(uint *)(prim + 2);
  auVar89 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  auVar90 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar74 = vunpcklps_avx512vl(auVar89._0_16_,auVar90._0_16_);
  fVar225 = *(float *)(ray + k * 4 + 0x180);
  auVar244._4_4_ = fVar225;
  auVar244._0_4_ = fVar225;
  auVar244._8_4_ = fVar225;
  auVar244._12_4_ = fVar225;
  local_740._16_4_ = fVar225;
  local_740._0_16_ = auVar244;
  local_740._20_4_ = fVar225;
  local_740._24_4_ = fVar225;
  local_740._28_4_ = fVar225;
  local_950 = vinsertps_avx(auVar74,auVar244,0x28);
  auVar82._0_4_ = auVar17._0_4_ + auVar18._0_4_ + auVar76._0_4_ + auVar77._0_4_;
  auVar82._4_4_ = auVar17._4_4_ + auVar18._4_4_ + auVar76._4_4_ + auVar77._4_4_;
  auVar82._8_4_ = auVar17._8_4_ + auVar18._8_4_ + auVar76._8_4_ + auVar77._8_4_;
  auVar82._12_4_ = auVar17._12_4_ + auVar18._12_4_ + auVar76._12_4_ + auVar77._12_4_;
  auVar80._8_4_ = 0x3e800000;
  auVar80._0_8_ = 0x3e8000003e800000;
  auVar80._12_4_ = 0x3e800000;
  auVar74 = vmulps_avx512vl(auVar82,auVar80);
  auVar74 = vsubps_avx(auVar74,auVar78);
  auVar74 = vdpps_avx(auVar74,local_950,0x7f);
  fVar145 = *(float *)(ray + k * 4 + 0xc0);
  local_970 = vdpps_avx(local_950,local_950,0x7f);
  auVar226._4_12_ = ZEXT812(0) << 0x20;
  auVar226._0_4_ = local_970._0_4_;
  auVar75 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar226);
  auVar81 = vfnmadd213ss_fma(auVar75,local_970,ZEXT416(0x40000000));
  local_540 = auVar74._0_4_ * auVar75._0_4_ * auVar81._0_4_;
  auVar227._4_4_ = local_540;
  auVar227._0_4_ = local_540;
  auVar227._8_4_ = local_540;
  auVar227._12_4_ = local_540;
  fStack_710 = local_540;
  _local_720 = auVar227;
  fStack_70c = local_540;
  fStack_708 = local_540;
  fStack_704 = local_540;
  auVar74 = vfmadd231ps_fma(auVar78,local_950,auVar227);
  auVar74 = vblendps_avx(auVar74,ZEXT816(0) << 0x40,8);
  auVar17 = vsubps_avx(auVar17,auVar74);
  auVar76 = vsubps_avx(auVar76,auVar74);
  auVar18 = vsubps_avx(auVar18,auVar74);
  auVar77 = vsubps_avx(auVar77,auVar74);
  uVar224 = auVar17._0_4_;
  auVar238._4_4_ = uVar224;
  auVar238._0_4_ = uVar224;
  auVar238._8_4_ = uVar224;
  auVar238._12_4_ = uVar224;
  auVar238._16_4_ = uVar224;
  auVar238._20_4_ = uVar224;
  auVar238._24_4_ = uVar224;
  auVar238._28_4_ = uVar224;
  auVar106._8_4_ = 1;
  auVar106._0_8_ = 0x100000001;
  auVar106._12_4_ = 1;
  auVar106._16_4_ = 1;
  auVar106._20_4_ = 1;
  auVar106._24_4_ = 1;
  auVar106._28_4_ = 1;
  local_7c0 = ZEXT1632(auVar17);
  auVar88 = vpermps_avx2(auVar106,local_7c0);
  auVar107._8_4_ = 2;
  auVar107._0_8_ = 0x200000002;
  auVar107._12_4_ = 2;
  auVar107._16_4_ = 2;
  auVar107._20_4_ = 2;
  auVar107._24_4_ = 2;
  auVar107._28_4_ = 2;
  auVar87 = vpermps_avx2(auVar107,local_7c0);
  auVar108._8_4_ = 3;
  auVar108._0_8_ = 0x300000003;
  auVar108._12_4_ = 3;
  auVar108._16_4_ = 3;
  auVar108._20_4_ = 3;
  auVar108._24_4_ = 3;
  auVar108._28_4_ = 3;
  auVar91 = vpermps_avx512vl(auVar108,local_7c0);
  uVar224 = auVar18._0_4_;
  local_840._4_4_ = uVar224;
  local_840._0_4_ = uVar224;
  local_840._8_4_ = uVar224;
  local_840._12_4_ = uVar224;
  local_840._16_4_ = uVar224;
  local_840._20_4_ = uVar224;
  local_840._24_4_ = uVar224;
  local_840._28_4_ = uVar224;
  local_800 = ZEXT1632(auVar18);
  local_9c0 = vpermps_avx2(auVar106,local_800);
  auVar92 = vpermps_avx512vl(auVar107,local_800);
  auVar93 = vpermps_avx512vl(auVar108,local_800);
  local_920 = vbroadcastss_avx512vl(auVar76);
  auVar245 = ZEXT3264(local_920);
  local_7e0 = ZEXT1632(auVar76);
  local_940 = vpermps_avx512vl(auVar106,local_7e0);
  auVar246 = ZEXT3264(local_940);
  auVar94 = vpermps_avx512vl(auVar107,local_7e0);
  auVar95 = vpermps_avx512vl(auVar108,local_7e0);
  local_560 = vbroadcastss_avx512vl(auVar77);
  _local_820 = ZEXT1632(auVar77);
  auVar96 = vpermps_avx512vl(auVar106,_local_820);
  auVar85 = vpermps_avx512vl(auVar107,_local_820);
  auVar86 = vpermps_avx512vl(auVar108,_local_820);
  auVar165 = ZEXT3264(local_840);
  auVar220 = ZEXT3264(local_9c0);
  auVar97 = vfmadd231ps_avx512vl(ZEXT432((uint)(fVar225 * fVar225)),auVar90,auVar90);
  local_600 = vfmadd231ps_avx512vl(auVar97,auVar89,auVar89);
  local_520._0_4_ = local_600._0_4_;
  local_520._4_4_ = local_520._0_4_;
  local_520._8_4_ = local_520._0_4_;
  local_520._12_4_ = local_520._0_4_;
  local_520._16_4_ = local_520._0_4_;
  local_520._20_4_ = local_520._0_4_;
  local_520._24_4_ = local_520._0_4_;
  local_520._28_4_ = local_520._0_4_;
  vandps_avx512vl(local_520,auVar247._0_32_);
  local_890 = ZEXT416((uint)local_540);
  local_540 = fVar145 - local_540;
  fStack_53c = local_540;
  fStack_538 = local_540;
  fStack_534 = local_540;
  fStack_530 = local_540;
  fStack_52c = local_540;
  fStack_528 = local_540;
  fStack_524 = local_540;
  auVar247 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar247);
  iVar66 = 1;
  bVar58 = 0;
  auVar247 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar247);
  auVar17 = vsqrtss_avx(local_970,local_970);
  auVar18 = vsqrtss_avx(local_970,local_970);
  local_8b0 = ZEXT816(0x3f80000000000000);
  auVar213 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  uVar57 = 0;
  do {
    auVar76 = vmovshdup_avx(local_8b0);
    auVar223._0_4_ = local_8b0._0_4_;
    fVar146 = auVar76._0_4_ - auVar223._0_4_;
    fVar239 = fVar146 * 0.04761905;
    auVar223._4_4_ = auVar223._0_4_;
    auVar223._8_4_ = auVar223._0_4_;
    auVar223._12_4_ = auVar223._0_4_;
    auVar223._16_4_ = auVar223._0_4_;
    auVar223._20_4_ = auVar223._0_4_;
    auVar223._24_4_ = auVar223._0_4_;
    auVar223._28_4_ = auVar223._0_4_;
    local_9a0._4_4_ = fVar146;
    local_9a0._0_4_ = fVar146;
    local_9a0._8_4_ = fVar146;
    local_9a0._12_4_ = fVar146;
    local_9a0._16_4_ = fVar146;
    local_9a0._20_4_ = fVar146;
    local_9a0._24_4_ = fVar146;
    local_9a0._28_4_ = fVar146;
    auVar76 = vfmadd231ps_fma(auVar223,local_9a0,_DAT_02020f20);
    auVar121 = auVar213._0_32_;
    auVar97 = vsubps_avx(auVar121,ZEXT1632(auVar76));
    fVar225 = auVar76._0_4_;
    auVar126._0_4_ = auVar165._0_4_ * fVar225;
    fVar232 = auVar76._4_4_;
    auVar126._4_4_ = auVar165._4_4_ * fVar232;
    fVar233 = auVar76._8_4_;
    auVar126._8_4_ = auVar165._8_4_ * fVar233;
    fVar234 = auVar76._12_4_;
    auVar126._12_4_ = auVar165._12_4_ * fVar234;
    auVar126._16_4_ = auVar165._16_4_ * 0.0;
    auVar126._20_4_ = auVar165._20_4_ * 0.0;
    auVar126._24_4_ = auVar165._24_4_ * 0.0;
    auVar126._28_4_ = 0;
    auVar98 = ZEXT1632(auVar76);
    auVar247._0_4_ = auVar220._0_4_ * fVar225;
    auVar247._4_4_ = auVar220._4_4_ * fVar232;
    auVar247._8_4_ = auVar220._8_4_ * fVar233;
    auVar247._12_4_ = auVar220._12_4_ * fVar234;
    auVar247._16_4_ = auVar220._16_4_ * 0.0;
    auVar247._20_4_ = auVar220._20_4_ * 0.0;
    auVar247._28_36_ = auVar165._28_36_;
    auVar247._24_4_ = auVar220._24_4_ * 0.0;
    auVar83 = vmulps_avx512vl(auVar92,auVar98);
    auVar84 = vmulps_avx512vl(auVar93,auVar98);
    auVar77 = vfmadd231ps_fma(auVar126,auVar97,auVar238);
    auVar74 = vfmadd231ps_fma(auVar247._0_32_,auVar97,auVar88);
    auVar78 = vfmadd231ps_fma(auVar83,auVar97,auVar87);
    auVar83 = vfmadd231ps_avx512vl(auVar84,auVar97,auVar91);
    auVar84 = vmulps_avx512vl(auVar245._0_32_,auVar98);
    auVar104 = ZEXT1632(auVar76);
    auVar98 = vmulps_avx512vl(auVar246._0_32_,auVar104);
    auVar99 = vmulps_avx512vl(auVar94,auVar104);
    auVar100 = vmulps_avx512vl(auVar95,auVar104);
    auVar81 = vfmadd231ps_fma(auVar84,auVar97,auVar165._0_32_);
    auVar84 = vfmadd231ps_avx512vl(auVar98,auVar97,auVar220._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar99,auVar97,auVar92);
    auVar99 = vfmadd231ps_avx512vl(auVar100,auVar97,auVar93);
    auVar100 = vmulps_avx512vl(local_560,auVar104);
    auVar101 = vmulps_avx512vl(auVar96,auVar104);
    auVar102 = vmulps_avx512vl(auVar85,auVar104);
    auVar103 = vmulps_avx512vl(auVar86,auVar104);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,auVar245._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,auVar246._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar97,auVar94);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar97,auVar95);
    auVar104 = vmulps_avx512vl(auVar104,ZEXT1632(auVar81));
    auVar108 = ZEXT1632(auVar76);
    auVar105 = vmulps_avx512vl(auVar108,auVar84);
    auVar106 = vmulps_avx512vl(auVar108,auVar98);
    auVar107 = vmulps_avx512vl(auVar108,auVar99);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar97,ZEXT1632(auVar77));
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar97,ZEXT1632(auVar74));
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar97,ZEXT1632(auVar78));
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar97,auVar83);
    auVar180._0_4_ = auVar100._0_4_ * fVar225;
    auVar180._4_4_ = auVar100._4_4_ * fVar232;
    auVar180._8_4_ = auVar100._8_4_ * fVar233;
    auVar180._12_4_ = auVar100._12_4_ * fVar234;
    auVar180._16_4_ = auVar100._16_4_ * 0.0;
    auVar180._20_4_ = auVar100._20_4_ * 0.0;
    auVar180._24_4_ = auVar100._24_4_ * 0.0;
    auVar180._28_4_ = 0;
    auVar114._4_4_ = auVar101._4_4_ * fVar232;
    auVar114._0_4_ = auVar101._0_4_ * fVar225;
    auVar114._8_4_ = auVar101._8_4_ * fVar233;
    auVar114._12_4_ = auVar101._12_4_ * fVar234;
    auVar114._16_4_ = auVar101._16_4_ * 0.0;
    auVar114._20_4_ = auVar101._20_4_ * 0.0;
    auVar114._24_4_ = auVar101._24_4_ * 0.0;
    auVar114._28_4_ = auVar100._28_4_;
    auVar115._4_4_ = auVar102._4_4_ * fVar232;
    auVar115._0_4_ = auVar102._0_4_ * fVar225;
    auVar115._8_4_ = auVar102._8_4_ * fVar233;
    auVar115._12_4_ = auVar102._12_4_ * fVar234;
    auVar115._16_4_ = auVar102._16_4_ * 0.0;
    auVar115._20_4_ = auVar102._20_4_ * 0.0;
    auVar115._24_4_ = auVar102._24_4_ * 0.0;
    auVar115._28_4_ = auVar101._28_4_;
    auVar116._4_4_ = auVar103._4_4_ * fVar232;
    auVar116._0_4_ = auVar103._0_4_ * fVar225;
    auVar116._8_4_ = auVar103._8_4_ * fVar233;
    auVar116._12_4_ = auVar103._12_4_ * fVar234;
    auVar116._16_4_ = auVar103._16_4_ * 0.0;
    auVar116._20_4_ = auVar103._20_4_ * 0.0;
    auVar116._24_4_ = auVar103._24_4_ * 0.0;
    auVar116._28_4_ = auVar102._28_4_;
    auVar76 = vfmadd231ps_fma(auVar180,auVar97,ZEXT1632(auVar81));
    auVar77 = vfmadd231ps_fma(auVar114,auVar97,auVar84);
    auVar74 = vfmadd231ps_fma(auVar115,auVar97,auVar98);
    auVar78 = vfmadd231ps_fma(auVar116,auVar97,auVar99);
    auVar117._28_4_ = auVar83._28_4_;
    auVar117._0_28_ =
         ZEXT1628(CONCAT412(fVar234 * auVar76._12_4_,
                            CONCAT48(fVar233 * auVar76._8_4_,
                                     CONCAT44(fVar232 * auVar76._4_4_,fVar225 * auVar76._0_4_))));
    auVar83 = vmulps_avx512vl(auVar108,ZEXT1632(auVar77));
    auVar84 = vmulps_avx512vl(auVar108,ZEXT1632(auVar74));
    auVar98 = vfmadd231ps_avx512vl(auVar117,auVar97,auVar104);
    local_760 = vfmadd231ps_avx512vl(auVar83,auVar97,auVar105);
    local_8e0 = vfmadd231ps_avx512vl(auVar84,auVar97,auVar106);
    auVar84 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar78._12_4_ * fVar234,
                                            CONCAT48(auVar78._8_4_ * fVar233,
                                                     CONCAT44(auVar78._4_4_ * fVar232,
                                                              auVar78._0_4_ * fVar225)))),auVar107,
                         auVar97);
    auVar97 = vsubps_avx512vl(ZEXT1632(auVar76),auVar104);
    auVar83 = vsubps_avx512vl(ZEXT1632(auVar77),auVar105);
    auVar100 = vsubps_avx512vl(ZEXT1632(auVar74),auVar106);
    auVar101 = vsubps_avx512vl(ZEXT1632(auVar78),auVar107);
    auVar122._4_4_ = fVar239 * auVar97._4_4_ * 3.0;
    auVar122._0_4_ = fVar239 * auVar97._0_4_ * 3.0;
    auVar122._8_4_ = fVar239 * auVar97._8_4_ * 3.0;
    auVar122._12_4_ = fVar239 * auVar97._12_4_ * 3.0;
    auVar122._16_4_ = fVar239 * auVar97._16_4_ * 3.0;
    auVar122._20_4_ = fVar239 * auVar97._20_4_ * 3.0;
    auVar122._24_4_ = fVar239 * auVar97._24_4_ * 3.0;
    auVar122._28_4_ = auVar99._28_4_;
    auVar241._0_4_ = fVar239 * auVar83._0_4_ * 3.0;
    auVar241._4_4_ = fVar239 * auVar83._4_4_ * 3.0;
    auVar241._8_4_ = fVar239 * auVar83._8_4_ * 3.0;
    auVar241._12_4_ = fVar239 * auVar83._12_4_ * 3.0;
    auVar241._16_4_ = fVar239 * auVar83._16_4_ * 3.0;
    auVar241._20_4_ = fVar239 * auVar83._20_4_ * 3.0;
    auVar241._24_4_ = fVar239 * auVar83._24_4_ * 3.0;
    auVar241._28_4_ = 0;
    auVar242._0_4_ = auVar100._0_4_ * 3.0 * fVar239;
    auVar242._4_4_ = auVar100._4_4_ * 3.0 * fVar239;
    auVar242._8_4_ = auVar100._8_4_ * 3.0 * fVar239;
    auVar242._12_4_ = auVar100._12_4_ * 3.0 * fVar239;
    auVar242._16_4_ = auVar100._16_4_ * 3.0 * fVar239;
    auVar242._20_4_ = auVar100._20_4_ * 3.0 * fVar239;
    auVar242._24_4_ = auVar100._24_4_ * 3.0 * fVar239;
    auVar242._28_4_ = 0;
    fVar225 = auVar101._0_4_ * 3.0 * fVar239;
    fVar232 = auVar101._4_4_ * 3.0 * fVar239;
    auVar118._4_4_ = fVar232;
    auVar118._0_4_ = fVar225;
    fVar233 = auVar101._8_4_ * 3.0 * fVar239;
    auVar118._8_4_ = fVar233;
    fVar234 = auVar101._12_4_ * 3.0 * fVar239;
    auVar118._12_4_ = fVar234;
    fVar235 = auVar101._16_4_ * 3.0 * fVar239;
    auVar118._16_4_ = fVar235;
    fVar207 = auVar101._20_4_ * 3.0 * fVar239;
    auVar118._20_4_ = fVar207;
    fVar236 = auVar101._24_4_ * 3.0 * fVar239;
    auVar118._24_4_ = fVar236;
    auVar118._28_4_ = fVar239;
    auVar76 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar99 = vpermt2ps_avx512vl(auVar98,_DAT_0205fd20,ZEXT1632(auVar76));
    auVar100 = vpermt2ps_avx512vl(local_760,_DAT_0205fd20,ZEXT1632(auVar76));
    auVar104 = ZEXT1632(auVar76);
    auVar101 = vpermt2ps_avx512vl(local_8e0,_DAT_0205fd20,auVar104);
    auVar181._0_4_ = auVar84._0_4_ + fVar225;
    auVar181._4_4_ = auVar84._4_4_ + fVar232;
    auVar181._8_4_ = auVar84._8_4_ + fVar233;
    auVar181._12_4_ = auVar84._12_4_ + fVar234;
    auVar181._16_4_ = auVar84._16_4_ + fVar235;
    auVar181._20_4_ = auVar84._20_4_ + fVar207;
    auVar181._24_4_ = auVar84._24_4_ + fVar236;
    auVar181._28_4_ = auVar84._28_4_ + fVar239;
    auVar97 = vmaxps_avx(auVar84,auVar181);
    auVar83 = vminps_avx(auVar84,auVar181);
    auVar102 = vpermt2ps_avx512vl(auVar84,_DAT_0205fd20,auVar104);
    auVar103 = vpermt2ps_avx512vl(auVar122,_DAT_0205fd20,auVar104);
    auVar104 = vpermt2ps_avx512vl(auVar241,_DAT_0205fd20,auVar104);
    auVar126 = ZEXT1632(auVar76);
    auVar105 = vpermt2ps_avx512vl(auVar242,_DAT_0205fd20,auVar126);
    auVar84 = vpermt2ps_avx512vl(auVar118,_DAT_0205fd20,auVar126);
    auVar106 = vsubps_avx512vl(auVar102,auVar84);
    auVar84 = vsubps_avx(auVar99,auVar98);
    auVar107 = vsubps_avx512vl(auVar100,local_760);
    auVar108 = vsubps_avx512vl(auVar101,local_8e0);
    auVar109 = vmulps_avx512vl(auVar107,auVar242);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar241,auVar108);
    auVar110 = vmulps_avx512vl(auVar108,auVar122);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar242,auVar84);
    auVar111 = vmulps_avx512vl(auVar84,auVar241);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar122,auVar107);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar110 = vmulps_avx512vl(auVar108,auVar108);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar107,auVar107);
    auVar112 = vfmadd231ps_avx512vl(auVar110,auVar84,auVar84);
    auVar110 = vrcp14ps_avx512vl(auVar112);
    auVar111 = vfnmadd213ps_avx512vl(auVar110,auVar112,auVar121);
    auVar110 = vfmadd132ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vmulps_avx512vl(auVar109,auVar110);
    auVar111 = vmulps_avx512vl(auVar107,auVar105);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar104,auVar108);
    auVar113 = vmulps_avx512vl(auVar108,auVar103);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar105,auVar84);
    auVar114 = vmulps_avx512vl(auVar84,auVar104);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar103,auVar107);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar111 = vfmadd231ps_avx512vl(auVar113,auVar111,auVar111);
    auVar110 = vmulps_avx512vl(auVar111,auVar110);
    auVar109 = vmaxps_avx512vl(auVar109,auVar110);
    auVar109 = vsqrtps_avx512vl(auVar109);
    auVar110 = vmaxps_avx512vl(auVar106,auVar102);
    auVar97 = vmaxps_avx512vl(auVar97,auVar110);
    auVar110 = vaddps_avx512vl(auVar109,auVar97);
    auVar97 = vminps_avx512vl(auVar106,auVar102);
    auVar97 = vminps_avx(auVar83,auVar97);
    auVar97 = vsubps_avx512vl(auVar97,auVar109);
    auVar109._8_4_ = 0x3f800002;
    auVar109._0_8_ = 0x3f8000023f800002;
    auVar109._12_4_ = 0x3f800002;
    auVar109._16_4_ = 0x3f800002;
    auVar109._20_4_ = 0x3f800002;
    auVar109._24_4_ = 0x3f800002;
    auVar109._28_4_ = 0x3f800002;
    auVar83 = vmulps_avx512vl(auVar110,auVar109);
    auVar110._8_4_ = 0x3f7ffffc;
    auVar110._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar110._12_4_ = 0x3f7ffffc;
    auVar110._16_4_ = 0x3f7ffffc;
    auVar110._20_4_ = 0x3f7ffffc;
    auVar110._24_4_ = 0x3f7ffffc;
    auVar110._28_4_ = 0x3f7ffffc;
    auVar97 = vmulps_avx512vl(auVar97,auVar110);
    auVar119._4_4_ = auVar83._4_4_ * auVar83._4_4_;
    auVar119._0_4_ = auVar83._0_4_ * auVar83._0_4_;
    auVar119._8_4_ = auVar83._8_4_ * auVar83._8_4_;
    auVar119._12_4_ = auVar83._12_4_ * auVar83._12_4_;
    auVar119._16_4_ = auVar83._16_4_ * auVar83._16_4_;
    auVar119._20_4_ = auVar83._20_4_ * auVar83._20_4_;
    auVar119._24_4_ = auVar83._24_4_ * auVar83._24_4_;
    auVar119._28_4_ = auVar97._28_4_;
    auVar83 = vrsqrt14ps_avx512vl(auVar112);
    auVar111._8_4_ = 0xbf000000;
    auVar111._0_8_ = 0xbf000000bf000000;
    auVar111._12_4_ = 0xbf000000;
    auVar111._16_4_ = 0xbf000000;
    auVar111._20_4_ = 0xbf000000;
    auVar111._24_4_ = 0xbf000000;
    auVar111._28_4_ = 0xbf000000;
    auVar102 = vmulps_avx512vl(auVar112,auVar111);
    auVar123._4_4_ = auVar83._4_4_ * auVar102._4_4_;
    auVar123._0_4_ = auVar83._0_4_ * auVar102._0_4_;
    auVar123._8_4_ = auVar83._8_4_ * auVar102._8_4_;
    auVar123._12_4_ = auVar83._12_4_ * auVar102._12_4_;
    auVar123._16_4_ = auVar83._16_4_ * auVar102._16_4_;
    auVar123._20_4_ = auVar83._20_4_ * auVar102._20_4_;
    auVar123._24_4_ = auVar83._24_4_ * auVar102._24_4_;
    auVar123._28_4_ = auVar102._28_4_;
    auVar102 = vmulps_avx512vl(auVar83,auVar83);
    auVar102 = vmulps_avx512vl(auVar102,auVar123);
    auVar112._8_4_ = 0x3fc00000;
    auVar112._0_8_ = 0x3fc000003fc00000;
    auVar112._12_4_ = 0x3fc00000;
    auVar112._16_4_ = 0x3fc00000;
    auVar112._20_4_ = 0x3fc00000;
    auVar112._24_4_ = 0x3fc00000;
    auVar112._28_4_ = 0x3fc00000;
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar83,auVar112);
    auVar125._4_4_ = auVar102._4_4_ * auVar84._4_4_;
    auVar125._0_4_ = auVar102._0_4_ * auVar84._0_4_;
    auVar125._8_4_ = auVar102._8_4_ * auVar84._8_4_;
    auVar125._12_4_ = auVar102._12_4_ * auVar84._12_4_;
    auVar125._16_4_ = auVar102._16_4_ * auVar84._16_4_;
    auVar125._20_4_ = auVar102._20_4_ * auVar84._20_4_;
    auVar125._24_4_ = auVar102._24_4_ * auVar84._24_4_;
    auVar125._28_4_ = auVar83._28_4_;
    auVar83 = vmulps_avx512vl(auVar107,auVar102);
    auVar106 = vmulps_avx512vl(auVar108,auVar102);
    auVar109 = vsubps_avx512vl(auVar126,auVar98);
    auVar110 = vsubps_avx512vl(auVar126,local_760);
    auVar111 = vsubps_avx512vl(auVar126,local_8e0);
    auVar112 = vmulps_avx512vl(local_740,auVar111);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar90,auVar110);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar89,auVar109);
    auVar113 = vmulps_avx512vl(auVar111,auVar111);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar110,auVar110);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar109,auVar109);
    auVar114 = vmulps_avx512vl(local_740,auVar106);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar83,auVar90);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar125,auVar89);
    auVar106 = vmulps_avx512vl(auVar111,auVar106);
    auVar83 = vfmadd231ps_avx512vl(auVar106,auVar110,auVar83);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar109,auVar125);
    local_900 = vmulps_avx512vl(auVar114,auVar114);
    auVar106 = vsubps_avx512vl(local_520,local_900);
    auVar115 = vmulps_avx512vl(auVar114,auVar83);
    auVar112 = vsubps_avx512vl(auVar112,auVar115);
    auVar112 = vaddps_avx512vl(auVar112,auVar112);
    auVar115 = vmulps_avx512vl(auVar83,auVar83);
    local_780 = vsubps_avx512vl(auVar113,auVar115);
    auVar115 = vsubps_avx512vl(local_780,auVar119);
    auVar116 = vmulps_avx512vl(auVar112,auVar112);
    auVar113._8_4_ = 0x40800000;
    auVar113._0_8_ = 0x4080000040800000;
    auVar113._12_4_ = 0x40800000;
    auVar113._16_4_ = 0x40800000;
    auVar113._20_4_ = 0x40800000;
    auVar113._24_4_ = 0x40800000;
    auVar113._28_4_ = 0x40800000;
    auVar113 = vmulps_avx512vl(auVar106,auVar113);
    auVar117 = vmulps_avx512vl(auVar113,auVar115);
    auVar117 = vsubps_avx512vl(auVar116,auVar117);
    uVar72 = vcmpps_avx512vl(auVar117,auVar126,5);
    bVar59 = (byte)uVar72;
    if (bVar59 == 0) {
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      in_ZMM31 = ZEXT3264(auVar115);
    }
    else {
      auVar117 = vsqrtps_avx512vl(auVar117);
      auVar118 = vaddps_avx512vl(auVar106,auVar106);
      auVar119 = vrcp14ps_avx512vl(auVar118);
      auVar118 = vfnmadd213ps_avx512vl(auVar118,auVar119,auVar121);
      auVar118 = vfmadd132ps_avx512vl(auVar118,auVar119,auVar119);
      auVar30._8_4_ = 0x80000000;
      auVar30._0_8_ = 0x8000000080000000;
      auVar30._12_4_ = 0x80000000;
      auVar30._16_4_ = 0x80000000;
      auVar30._20_4_ = 0x80000000;
      auVar30._24_4_ = 0x80000000;
      auVar30._28_4_ = 0x80000000;
      auVar119 = vxorps_avx512vl(auVar112,auVar30);
      auVar119 = vsubps_avx512vl(auVar119,auVar117);
      auVar119 = vmulps_avx512vl(auVar119,auVar118);
      auVar117 = vsubps_avx512vl(auVar117,auVar112);
      auVar117 = vmulps_avx512vl(auVar117,auVar118);
      auVar118 = vfmadd213ps_avx512vl(auVar114,auVar119,auVar83);
      local_640 = vmulps_avx512vl(auVar102,auVar118);
      auVar118 = vfmadd213ps_avx512vl(auVar114,auVar117,auVar83);
      local_660 = vmulps_avx512vl(auVar102,auVar118);
      auVar154._8_4_ = 0x7f800000;
      auVar154._0_8_ = 0x7f8000007f800000;
      auVar154._12_4_ = 0x7f800000;
      auVar154._16_4_ = 0x7f800000;
      auVar154._20_4_ = 0x7f800000;
      auVar154._24_4_ = 0x7f800000;
      auVar154._28_4_ = 0x7f800000;
      auVar118 = vblendmps_avx512vl(auVar154,auVar119);
      auVar121._0_4_ =
           (uint)(bVar59 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar59 & 1) * local_660._0_4_;
      bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar121._4_4_ = (uint)bVar69 * auVar118._4_4_ | (uint)!bVar69 * local_660._4_4_;
      bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar121._8_4_ = (uint)bVar69 * auVar118._8_4_ | (uint)!bVar69 * local_660._8_4_;
      bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar121._12_4_ = (uint)bVar69 * auVar118._12_4_ | (uint)!bVar69 * local_660._12_4_;
      bVar69 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar121._16_4_ = (uint)bVar69 * auVar118._16_4_ | (uint)!bVar69 * local_660._16_4_;
      bVar69 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar121._20_4_ = (uint)bVar69 * auVar118._20_4_ | (uint)!bVar69 * local_660._20_4_;
      bVar69 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar121._24_4_ = (uint)bVar69 * auVar118._24_4_ | (uint)!bVar69 * local_660._24_4_;
      bVar69 = SUB81(uVar72 >> 7,0);
      auVar121._28_4_ = (uint)bVar69 * auVar118._28_4_ | (uint)!bVar69 * local_660._28_4_;
      auVar155._8_4_ = 0xff800000;
      auVar155._0_8_ = 0xff800000ff800000;
      auVar155._12_4_ = 0xff800000;
      auVar155._16_4_ = 0xff800000;
      auVar155._20_4_ = 0xff800000;
      auVar155._24_4_ = 0xff800000;
      auVar155._28_4_ = 0xff800000;
      auVar118 = vblendmps_avx512vl(auVar155,auVar117);
      auVar120._0_4_ =
           (uint)(bVar59 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar117._0_4_;
      bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar120._4_4_ = (uint)bVar69 * auVar118._4_4_ | (uint)!bVar69 * auVar117._4_4_;
      bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar120._8_4_ = (uint)bVar69 * auVar118._8_4_ | (uint)!bVar69 * auVar117._8_4_;
      bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar120._12_4_ = (uint)bVar69 * auVar118._12_4_ | (uint)!bVar69 * auVar117._12_4_;
      bVar69 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar120._16_4_ = (uint)bVar69 * auVar118._16_4_ | (uint)!bVar69 * auVar117._16_4_;
      bVar69 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar120._20_4_ = (uint)bVar69 * auVar118._20_4_ | (uint)!bVar69 * auVar117._20_4_;
      bVar69 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar120._24_4_ = (uint)bVar69 * auVar118._24_4_ | (uint)!bVar69 * auVar117._24_4_;
      bVar69 = SUB81(uVar72 >> 7,0);
      auVar120._28_4_ = (uint)bVar69 * auVar118._28_4_ | (uint)!bVar69 * auVar117._28_4_;
      in_ZMM31 = ZEXT3264(auVar120);
      auVar156._8_4_ = 0x7fffffff;
      auVar156._0_8_ = 0x7fffffff7fffffff;
      auVar156._12_4_ = 0x7fffffff;
      auVar156._16_4_ = 0x7fffffff;
      auVar156._20_4_ = 0x7fffffff;
      auVar156._24_4_ = 0x7fffffff;
      auVar156._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_900,auVar156);
      auVar117 = vmaxps_avx512vl(local_600,auVar120);
      auVar31._8_4_ = 0x36000000;
      auVar31._0_8_ = 0x3600000036000000;
      auVar31._12_4_ = 0x36000000;
      auVar31._16_4_ = 0x36000000;
      auVar31._20_4_ = 0x36000000;
      auVar31._24_4_ = 0x36000000;
      auVar31._28_4_ = 0x36000000;
      auVar118 = vmulps_avx512vl(auVar117,auVar31);
      auVar117 = vandps_avx(auVar106,auVar156);
      uVar60 = vcmpps_avx512vl(auVar117,auVar118,1);
      uVar72 = uVar72 & uVar60;
      bVar62 = (byte)uVar72;
      if (bVar62 != 0) {
        uVar60 = vcmpps_avx512vl(auVar115,_DAT_02020f00,2);
        auVar182._8_4_ = 0xff800000;
        auVar182._0_8_ = 0xff800000ff800000;
        auVar182._12_4_ = 0xff800000;
        auVar182._16_4_ = 0xff800000;
        auVar182._20_4_ = 0xff800000;
        auVar182._24_4_ = 0xff800000;
        auVar182._28_4_ = 0xff800000;
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar118 = vblendmps_avx512vl(auVar115,auVar182);
        bVar56 = (byte)uVar60;
        uVar73 = (uint)(bVar56 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar117._0_4_;
        bVar69 = (bool)((byte)(uVar60 >> 1) & 1);
        uVar138 = (uint)bVar69 * auVar118._4_4_ | (uint)!bVar69 * auVar117._4_4_;
        bVar69 = (bool)((byte)(uVar60 >> 2) & 1);
        uVar139 = (uint)bVar69 * auVar118._8_4_ | (uint)!bVar69 * auVar117._8_4_;
        bVar69 = (bool)((byte)(uVar60 >> 3) & 1);
        uVar140 = (uint)bVar69 * auVar118._12_4_ | (uint)!bVar69 * auVar117._12_4_;
        bVar69 = (bool)((byte)(uVar60 >> 4) & 1);
        uVar141 = (uint)bVar69 * auVar118._16_4_ | (uint)!bVar69 * auVar117._16_4_;
        bVar69 = (bool)((byte)(uVar60 >> 5) & 1);
        uVar142 = (uint)bVar69 * auVar118._20_4_ | (uint)!bVar69 * auVar117._20_4_;
        bVar69 = (bool)((byte)(uVar60 >> 6) & 1);
        uVar143 = (uint)bVar69 * auVar118._24_4_ | (uint)!bVar69 * auVar117._24_4_;
        bVar69 = SUB81(uVar60 >> 7,0);
        uVar144 = (uint)bVar69 * auVar118._28_4_ | (uint)!bVar69 * auVar117._28_4_;
        auVar121._0_4_ = (bVar62 & 1) * uVar73 | !(bool)(bVar62 & 1) * auVar121._0_4_;
        bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar121._4_4_ = bVar69 * uVar138 | !bVar69 * auVar121._4_4_;
        bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar121._8_4_ = bVar69 * uVar139 | !bVar69 * auVar121._8_4_;
        bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar121._12_4_ = bVar69 * uVar140 | !bVar69 * auVar121._12_4_;
        bVar69 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar121._16_4_ = bVar69 * uVar141 | !bVar69 * auVar121._16_4_;
        bVar69 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar121._20_4_ = bVar69 * uVar142 | !bVar69 * auVar121._20_4_;
        bVar69 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar121._24_4_ = bVar69 * uVar143 | !bVar69 * auVar121._24_4_;
        bVar69 = SUB81(uVar72 >> 7,0);
        auVar121._28_4_ = bVar69 * uVar144 | !bVar69 * auVar121._28_4_;
        auVar115 = vblendmps_avx512vl(auVar182,auVar115);
        bVar69 = (bool)((byte)(uVar60 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar60 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar60 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar60 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar60 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
        bVar15 = SUB81(uVar60 >> 7,0);
        bVar4 = (bool)((byte)(uVar72 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar72 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar72 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar72 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar72 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
        bVar16 = SUB81(uVar72 >> 7,0);
        in_ZMM31 = ZEXT3264(CONCAT428((uint)bVar16 *
                                      ((uint)bVar15 * auVar115._28_4_ | !bVar15 * uVar144) |
                                      !bVar16 * auVar120._28_4_,
                                      CONCAT424((uint)bVar14 *
                                                ((uint)bVar13 * auVar115._24_4_ | !bVar13 * uVar143)
                                                | !bVar14 * auVar120._24_4_,
                                                CONCAT420((uint)bVar12 *
                                                          ((uint)bVar11 * auVar115._20_4_ |
                                                          !bVar11 * uVar142) |
                                                          !bVar12 * auVar120._20_4_,
                                                          CONCAT416((uint)bVar10 *
                                                                    ((uint)bVar9 * auVar115._16_4_ |
                                                                    !bVar9 * uVar141) |
                                                                    !bVar10 * auVar120._16_4_,
                                                                    CONCAT412((uint)bVar8 *
                                                                              ((uint)bVar7 *
                                                                               auVar115._12_4_ |
                                                                              !bVar7 * uVar140) |
                                                                              !bVar8 * auVar120.
                                                  _12_4_,CONCAT48((uint)bVar6 *
                                                                  ((uint)bVar5 * auVar115._8_4_ |
                                                                  !bVar5 * uVar139) |
                                                                  !bVar6 * auVar120._8_4_,
                                                                  CONCAT44((uint)bVar4 *
                                                                           ((uint)bVar69 *
                                                                            auVar115._4_4_ |
                                                                           !bVar69 * uVar138) |
                                                                           !bVar4 * auVar120._4_4_,
                                                                           (uint)(bVar62 & 1) *
                                                                           ((uint)(bVar56 & 1) *
                                                                            auVar115._0_4_ |
                                                                           !(bool)(bVar56 & 1) *
                                                                           uVar73) | !(bool)(bVar62 
                                                  & 1) * auVar120._0_4_))))))));
        bVar59 = (~bVar62 | bVar56) & bVar59;
      }
    }
    if ((bVar59 & 0x7f) == 0) {
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar247 = ZEXT3264(auVar97);
      auVar124._8_4_ = 0x3f800000;
      auVar124._0_8_ = &DAT_3f8000003f800000;
      auVar124._12_4_ = 0x3f800000;
      auVar124._16_4_ = 0x3f800000;
      auVar124._20_4_ = 0x3f800000;
      auVar124._24_4_ = 0x3f800000;
      auVar124._28_4_ = 0x3f800000;
LAB_01d1509d:
      auVar213 = ZEXT3264(auVar124);
      auVar165 = ZEXT3264(local_840);
      auVar220 = ZEXT3264(local_9c0);
      auVar245 = ZEXT3264(local_920);
      auVar246 = ZEXT3264(local_940);
    }
    else {
      fVar225 = *(float *)(ray + k * 4 + 0x200) - (float)local_890._0_4_;
      auVar157._4_4_ = fVar225;
      auVar157._0_4_ = fVar225;
      auVar157._8_4_ = fVar225;
      auVar157._12_4_ = fVar225;
      auVar157._16_4_ = fVar225;
      auVar157._20_4_ = fVar225;
      auVar157._24_4_ = fVar225;
      auVar157._28_4_ = fVar225;
      auVar115 = vminps_avx512vl(auVar157,in_ZMM31._0_32_);
      auVar54._4_4_ = fStack_53c;
      auVar54._0_4_ = local_540;
      auVar54._8_4_ = fStack_538;
      auVar54._12_4_ = fStack_534;
      auVar54._16_4_ = fStack_530;
      auVar54._20_4_ = fStack_52c;
      auVar54._24_4_ = fStack_528;
      auVar54._28_4_ = fStack_524;
      auVar117 = vmaxps_avx512vl(auVar54,auVar121);
      auVar111 = vmulps_avx512vl(auVar111,auVar242);
      auVar110 = vfmadd213ps_avx512vl(auVar110,auVar241,auVar111);
      auVar109 = vfmadd213ps_avx512vl(auVar109,auVar122,auVar110);
      auVar110 = vmulps_avx512vl(local_740,auVar242);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar90,auVar241);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar89,auVar122);
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar247 = ZEXT3264(auVar111);
      vandps_avx512vl(auVar110,auVar111);
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar20 = vcmpps_avx512vl(auVar111,auVar122,1);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      in_ZMM31 = ZEXT3264(auVar118);
      auVar109 = vxorps_avx512vl(auVar109,auVar118);
      auVar119 = vrcp14ps_avx512vl(auVar110);
      auVar123 = vxorps_avx512vl(auVar110,auVar118);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar125 = vfnmadd213ps_avx512vl(auVar119,auVar110,auVar124);
      auVar125 = vfmadd132ps_avx512vl(auVar125,auVar119,auVar119);
      auVar125 = vmulps_avx512vl(auVar125,auVar109);
      uVar22 = vcmpps_avx512vl(auVar110,auVar123,1);
      bVar62 = (byte)uVar20 | (byte)uVar22;
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar109 = vblendmps_avx512vl(auVar125,auVar126);
      auVar127._0_4_ =
           (uint)(bVar62 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar119._0_4_;
      bVar69 = (bool)(bVar62 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar69 * auVar109._4_4_ | (uint)!bVar69 * auVar119._4_4_;
      bVar69 = (bool)(bVar62 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar69 * auVar109._8_4_ | (uint)!bVar69 * auVar119._8_4_;
      bVar69 = (bool)(bVar62 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar69 * auVar109._12_4_ | (uint)!bVar69 * auVar119._12_4_;
      bVar69 = (bool)(bVar62 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar69 * auVar109._16_4_ | (uint)!bVar69 * auVar119._16_4_;
      bVar69 = (bool)(bVar62 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar69 * auVar109._20_4_ | (uint)!bVar69 * auVar119._20_4_;
      bVar69 = (bool)(bVar62 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar69 * auVar109._24_4_ | (uint)!bVar69 * auVar119._24_4_;
      auVar127._28_4_ =
           (uint)(bVar62 >> 7) * auVar109._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar119._28_4_;
      auVar109 = vmaxps_avx(auVar117,auVar127);
      uVar22 = vcmpps_avx512vl(auVar110,auVar123,6);
      bVar62 = (byte)uVar20 | (byte)uVar22;
      auVar128._0_4_ = (uint)(bVar62 & 1) * 0x7f800000 | (uint)!(bool)(bVar62 & 1) * auVar125._0_4_;
      bVar69 = (bool)(bVar62 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * auVar125._4_4_;
      bVar69 = (bool)(bVar62 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * auVar125._8_4_;
      bVar69 = (bool)(bVar62 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * auVar125._12_4_;
      bVar69 = (bool)(bVar62 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * auVar125._16_4_;
      bVar69 = (bool)(bVar62 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * auVar125._20_4_;
      bVar69 = (bool)(bVar62 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * auVar125._24_4_;
      auVar128._28_4_ =
           (uint)(bVar62 >> 7) * 0x7f800000 | (uint)!(bool)(bVar62 >> 7) * auVar125._28_4_;
      auVar110 = vminps_avx(auVar115,auVar128);
      auVar77 = vxorps_avx512vl(auVar123._0_16_,auVar123._0_16_);
      auVar99 = vsubps_avx512vl(ZEXT1632(auVar77),auVar99);
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar77),auVar100);
      auVar101 = vsubps_avx512vl(ZEXT1632(auVar77),auVar101);
      auVar41._4_4_ = auVar101._4_4_ * auVar105._4_4_;
      auVar41._0_4_ = auVar101._0_4_ * auVar105._0_4_;
      auVar41._8_4_ = auVar101._8_4_ * auVar105._8_4_;
      auVar41._12_4_ = auVar101._12_4_ * auVar105._12_4_;
      auVar41._16_4_ = auVar101._16_4_ * auVar105._16_4_;
      auVar41._20_4_ = auVar101._20_4_ * auVar105._20_4_;
      auVar41._24_4_ = auVar101._24_4_ * auVar105._24_4_;
      auVar41._28_4_ = auVar101._28_4_;
      auVar100 = vfnmsub231ps_avx512vl(auVar41,auVar104,auVar100);
      auVar99 = vfnmadd231ps_avx512vl(auVar100,auVar103,auVar99);
      auVar100 = vmulps_avx512vl(local_740,auVar105);
      auVar100 = vfnmsub231ps_avx512vl(auVar100,auVar90,auVar104);
      auVar100 = vfnmadd231ps_avx512vl(auVar100,auVar89,auVar103);
      vandps_avx512vl(auVar100,auVar111);
      uVar20 = vcmpps_avx512vl(auVar100,auVar122,1);
      auVar99 = vxorps_avx512vl(auVar99,auVar118);
      auVar101 = vrcp14ps_avx512vl(auVar100);
      auVar103 = vxorps_avx512vl(auVar100,auVar118);
      auVar105 = vfnmadd213ps_avx512vl(auVar101,auVar100,auVar124);
      auVar76 = vfmadd132ps_fma(auVar105,auVar101,auVar101);
      fVar225 = auVar76._0_4_ * auVar99._0_4_;
      fVar232 = auVar76._4_4_ * auVar99._4_4_;
      auVar42._4_4_ = fVar232;
      auVar42._0_4_ = fVar225;
      fVar233 = auVar76._8_4_ * auVar99._8_4_;
      auVar42._8_4_ = fVar233;
      fVar234 = auVar76._12_4_ * auVar99._12_4_;
      auVar42._12_4_ = fVar234;
      fVar239 = auVar99._16_4_ * 0.0;
      auVar42._16_4_ = fVar239;
      fVar235 = auVar99._20_4_ * 0.0;
      auVar42._20_4_ = fVar235;
      fVar207 = auVar99._24_4_ * 0.0;
      auVar42._24_4_ = fVar207;
      auVar42._28_4_ = auVar99._28_4_;
      uVar22 = vcmpps_avx512vl(auVar100,auVar103,1);
      bVar62 = (byte)uVar20 | (byte)uVar22;
      auVar105 = vblendmps_avx512vl(auVar42,auVar126);
      auVar129._0_4_ =
           (uint)(bVar62 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar101._0_4_;
      bVar69 = (bool)(bVar62 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar69 * auVar105._4_4_ | (uint)!bVar69 * auVar101._4_4_;
      bVar69 = (bool)(bVar62 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar69 * auVar105._8_4_ | (uint)!bVar69 * auVar101._8_4_;
      bVar69 = (bool)(bVar62 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar69 * auVar105._12_4_ | (uint)!bVar69 * auVar101._12_4_;
      bVar69 = (bool)(bVar62 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar69 * auVar105._16_4_ | (uint)!bVar69 * auVar101._16_4_;
      bVar69 = (bool)(bVar62 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar69 * auVar105._20_4_ | (uint)!bVar69 * auVar101._20_4_;
      bVar69 = (bool)(bVar62 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar69 * auVar105._24_4_ | (uint)!bVar69 * auVar101._24_4_;
      auVar129._28_4_ =
           (uint)(bVar62 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar101._28_4_;
      _local_7a0 = vmaxps_avx(auVar109,auVar129);
      uVar22 = vcmpps_avx512vl(auVar100,auVar103,6);
      bVar62 = (byte)uVar20 | (byte)uVar22;
      auVar130._0_4_ = (uint)(bVar62 & 1) * 0x7f800000 | (uint)!(bool)(bVar62 & 1) * (int)fVar225;
      bVar69 = (bool)(bVar62 >> 1 & 1);
      auVar130._4_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar232;
      bVar69 = (bool)(bVar62 >> 2 & 1);
      auVar130._8_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar233;
      bVar69 = (bool)(bVar62 >> 3 & 1);
      auVar130._12_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar234;
      bVar69 = (bool)(bVar62 >> 4 & 1);
      auVar130._16_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar239;
      bVar69 = (bool)(bVar62 >> 5 & 1);
      auVar130._20_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar235;
      bVar69 = (bool)(bVar62 >> 6 & 1);
      auVar130._24_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar207;
      auVar130._28_4_ =
           (uint)(bVar62 >> 7) * 0x7f800000 | (uint)!(bool)(bVar62 >> 7) * auVar99._28_4_;
      local_5c0 = vminps_avx(auVar110,auVar130);
      uVar20 = vcmpps_avx512vl(_local_7a0,local_5c0,2);
      bVar59 = bVar59 & 0x7f & (byte)uVar20;
      if (bVar59 == 0) goto LAB_01d1509d;
      auVar99 = vmaxps_avx512vl(ZEXT1632(auVar77),auVar97);
      auVar97 = vminps_avx512vl(local_640,auVar124);
      auVar49 = ZEXT412(0);
      auVar100 = ZEXT1232(auVar49) << 0x20;
      auVar97 = vmaxps_avx(auVar97,ZEXT1232(auVar49) << 0x20);
      auVar101 = vminps_avx512vl(local_660,auVar124);
      auVar43._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
      auVar43._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
      auVar43._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
      auVar43._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
      auVar43._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
      auVar43._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
      auVar43._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
      auVar43._28_4_ = auVar97._28_4_ + 7.0;
      auVar76 = vfmadd213ps_fma(auVar43,local_9a0,auVar223);
      local_640 = ZEXT1632(auVar76);
      auVar97 = vmaxps_avx(auVar101,ZEXT1232(auVar49) << 0x20);
      auVar44._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
      auVar44._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
      auVar44._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
      auVar44._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
      auVar44._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
      auVar44._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
      auVar44._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
      auVar44._28_4_ = auVar97._28_4_ + 7.0;
      auVar76 = vfmadd213ps_fma(auVar44,local_9a0,auVar223);
      local_660 = ZEXT1632(auVar76);
      auVar158._0_4_ = auVar99._0_4_ * auVar99._0_4_;
      auVar158._4_4_ = auVar99._4_4_ * auVar99._4_4_;
      auVar158._8_4_ = auVar99._8_4_ * auVar99._8_4_;
      auVar158._12_4_ = auVar99._12_4_ * auVar99._12_4_;
      auVar158._16_4_ = auVar99._16_4_ * auVar99._16_4_;
      auVar158._20_4_ = auVar99._20_4_ * auVar99._20_4_;
      auVar158._24_4_ = auVar99._24_4_ * auVar99._24_4_;
      auVar158._28_4_ = 0;
      auVar97 = vsubps_avx(local_780,auVar158);
      auVar99 = vmulps_avx512vl(auVar113,auVar97);
      auVar99 = vsubps_avx(auVar116,auVar99);
      uVar20 = vcmpps_avx512vl(auVar99,ZEXT1232(auVar49) << 0x20,5);
      bVar62 = (byte)uVar20;
      if (bVar62 == 0) {
        auVar83 = ZEXT832(0) << 0x20;
        auVar84 = ZEXT832(0) << 0x20;
        auVar101 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar103 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar99 = ZEXT832(0) << 0x20;
        auVar131._8_4_ = 0x7f800000;
        auVar131._0_8_ = 0x7f8000007f800000;
        auVar131._12_4_ = 0x7f800000;
        auVar131._16_4_ = 0x7f800000;
        auVar131._20_4_ = 0x7f800000;
        auVar131._24_4_ = 0x7f800000;
        auVar131._28_4_ = 0x7f800000;
        auVar132._8_4_ = 0xff800000;
        auVar132._0_8_ = 0xff800000ff800000;
        auVar132._12_4_ = 0xff800000;
        auVar132._16_4_ = 0xff800000;
        auVar132._20_4_ = 0xff800000;
        auVar132._24_4_ = 0xff800000;
        auVar132._28_4_ = 0xff800000;
      }
      else {
        auVar74 = vxorps_avx512vl(auVar104._0_16_,auVar104._0_16_);
        uVar72 = vcmpps_avx512vl(auVar99,ZEXT1632(auVar77),5);
        auVar99 = vsqrtps_avx(auVar99);
        auVar183._0_4_ = auVar106._0_4_ + auVar106._0_4_;
        auVar183._4_4_ = auVar106._4_4_ + auVar106._4_4_;
        auVar183._8_4_ = auVar106._8_4_ + auVar106._8_4_;
        auVar183._12_4_ = auVar106._12_4_ + auVar106._12_4_;
        auVar183._16_4_ = auVar106._16_4_ + auVar106._16_4_;
        auVar183._20_4_ = auVar106._20_4_ + auVar106._20_4_;
        auVar183._24_4_ = auVar106._24_4_ + auVar106._24_4_;
        auVar183._28_4_ = auVar106._28_4_ + auVar106._28_4_;
        auVar100 = vrcp14ps_avx512vl(auVar183);
        auVar101 = vfnmadd213ps_avx512vl(auVar183,auVar100,auVar124);
        auVar76 = vfmadd132ps_fma(auVar101,auVar100,auVar100);
        auVar32._8_4_ = 0x80000000;
        auVar32._0_8_ = 0x8000000080000000;
        auVar32._12_4_ = 0x80000000;
        auVar32._16_4_ = 0x80000000;
        auVar32._20_4_ = 0x80000000;
        auVar32._24_4_ = 0x80000000;
        auVar32._28_4_ = 0x80000000;
        auVar100 = vxorps_avx512vl(auVar112,auVar32);
        auVar100 = vsubps_avx(auVar100,auVar99);
        auVar45._4_4_ = auVar100._4_4_ * auVar76._4_4_;
        auVar45._0_4_ = auVar100._0_4_ * auVar76._0_4_;
        auVar45._8_4_ = auVar100._8_4_ * auVar76._8_4_;
        auVar45._12_4_ = auVar100._12_4_ * auVar76._12_4_;
        auVar45._16_4_ = auVar100._16_4_ * 0.0;
        auVar45._20_4_ = auVar100._20_4_ * 0.0;
        auVar45._24_4_ = auVar100._24_4_ * 0.0;
        auVar45._28_4_ = 0x3e000000;
        auVar99 = vsubps_avx512vl(auVar99,auVar112);
        auVar46._4_4_ = auVar99._4_4_ * auVar76._4_4_;
        auVar46._0_4_ = auVar99._0_4_ * auVar76._0_4_;
        auVar46._8_4_ = auVar99._8_4_ * auVar76._8_4_;
        auVar46._12_4_ = auVar99._12_4_ * auVar76._12_4_;
        auVar46._16_4_ = auVar99._16_4_ * 0.0;
        auVar46._20_4_ = auVar99._20_4_ * 0.0;
        auVar46._24_4_ = auVar99._24_4_ * 0.0;
        auVar46._28_4_ = fVar146;
        auVar99 = vfmadd213ps_avx512vl(auVar114,auVar45,auVar83);
        auVar47._4_4_ = auVar102._4_4_ * auVar99._4_4_;
        auVar47._0_4_ = auVar102._0_4_ * auVar99._0_4_;
        auVar47._8_4_ = auVar102._8_4_ * auVar99._8_4_;
        auVar47._12_4_ = auVar102._12_4_ * auVar99._12_4_;
        auVar47._16_4_ = auVar102._16_4_ * auVar99._16_4_;
        auVar47._20_4_ = auVar102._20_4_ * auVar99._20_4_;
        auVar47._24_4_ = auVar102._24_4_ * auVar99._24_4_;
        auVar47._28_4_ = auVar100._28_4_;
        auVar99 = vmulps_avx512vl(auVar89,auVar45);
        auVar100 = vmulps_avx512vl(auVar90,auVar45);
        auVar104 = vmulps_avx512vl(local_740,auVar45);
        auVar101 = vfmadd213ps_avx512vl(auVar84,auVar47,auVar98);
        auVar101 = vsubps_avx512vl(auVar99,auVar101);
        auVar99 = vfmadd213ps_avx512vl(auVar107,auVar47,local_760);
        auVar103 = vsubps_avx512vl(auVar100,auVar99);
        auVar76 = vfmadd213ps_fma(auVar47,auVar108,local_8e0);
        auVar99 = vsubps_avx(auVar104,ZEXT1632(auVar76));
        auVar83 = vfmadd213ps_avx512vl(auVar114,auVar46,auVar83);
        auVar102 = vmulps_avx512vl(auVar102,auVar83);
        auVar83 = vmulps_avx512vl(auVar89,auVar46);
        auVar104 = vmulps_avx512vl(auVar90,auVar46);
        auVar105 = vmulps_avx512vl(local_740,auVar46);
        auVar76 = vfmadd213ps_fma(auVar84,auVar102,auVar98);
        auVar100 = vsubps_avx(auVar83,ZEXT1632(auVar76));
        auVar76 = vfmadd213ps_fma(auVar107,auVar102,local_760);
        auVar83 = vsubps_avx512vl(auVar104,ZEXT1632(auVar76));
        auVar76 = vfmadd213ps_fma(auVar108,auVar102,local_8e0);
        auVar84 = vsubps_avx512vl(auVar105,ZEXT1632(auVar76));
        auVar203._8_4_ = 0x7f800000;
        auVar203._0_8_ = 0x7f8000007f800000;
        auVar203._12_4_ = 0x7f800000;
        auVar203._16_4_ = 0x7f800000;
        auVar203._20_4_ = 0x7f800000;
        auVar203._24_4_ = 0x7f800000;
        auVar203._28_4_ = 0x7f800000;
        auVar102 = vblendmps_avx512vl(auVar203,auVar45);
        bVar69 = (bool)((byte)uVar72 & 1);
        auVar131._0_4_ = (uint)bVar69 * auVar102._0_4_ | (uint)!bVar69 * auVar98._0_4_;
        bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar131._4_4_ = (uint)bVar69 * auVar102._4_4_ | (uint)!bVar69 * auVar98._4_4_;
        bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar131._8_4_ = (uint)bVar69 * auVar102._8_4_ | (uint)!bVar69 * auVar98._8_4_;
        bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar131._12_4_ = (uint)bVar69 * auVar102._12_4_ | (uint)!bVar69 * auVar98._12_4_;
        bVar69 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar131._16_4_ = (uint)bVar69 * auVar102._16_4_ | (uint)!bVar69 * auVar98._16_4_;
        bVar69 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar131._20_4_ = (uint)bVar69 * auVar102._20_4_ | (uint)!bVar69 * auVar98._20_4_;
        bVar69 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar131._24_4_ = (uint)bVar69 * auVar102._24_4_ | (uint)!bVar69 * auVar98._24_4_;
        bVar69 = SUB81(uVar72 >> 7,0);
        auVar131._28_4_ = (uint)bVar69 * auVar102._28_4_ | (uint)!bVar69 * auVar98._28_4_;
        auVar204._8_4_ = 0xff800000;
        auVar204._0_8_ = 0xff800000ff800000;
        auVar204._12_4_ = 0xff800000;
        auVar204._16_4_ = 0xff800000;
        auVar204._20_4_ = 0xff800000;
        auVar204._24_4_ = 0xff800000;
        auVar204._28_4_ = 0xff800000;
        auVar98 = vblendmps_avx512vl(auVar204,auVar46);
        bVar69 = (bool)((byte)uVar72 & 1);
        auVar132._0_4_ = (uint)bVar69 * auVar98._0_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar69 * auVar98._4_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar69 * auVar98._8_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar69 * auVar98._12_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar132._16_4_ = (uint)bVar69 * auVar98._16_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar132._20_4_ = (uint)bVar69 * auVar98._20_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar132._24_4_ = (uint)bVar69 * auVar98._24_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = SUB81(uVar72 >> 7,0);
        auVar132._28_4_ = (uint)bVar69 * auVar98._28_4_ | (uint)!bVar69 * -0x800000;
        vandps_avx512vl(auVar111,local_900);
        auVar98 = vmaxps_avx(local_600,auVar132);
        auVar33._8_4_ = 0x36000000;
        auVar33._0_8_ = 0x3600000036000000;
        auVar33._12_4_ = 0x36000000;
        auVar33._16_4_ = 0x36000000;
        auVar33._20_4_ = 0x36000000;
        auVar33._24_4_ = 0x36000000;
        auVar33._28_4_ = 0x36000000;
        auVar98 = vmulps_avx512vl(auVar98,auVar33);
        vandps_avx512vl(auVar106,auVar111);
        uVar60 = vcmpps_avx512vl(auVar98,auVar98,1);
        uVar72 = uVar72 & uVar60;
        bVar56 = (byte)uVar72;
        if (bVar56 != 0) {
          uVar60 = vcmpps_avx512vl(auVar97,ZEXT1632(auVar74),2);
          auVar237._8_4_ = 0xff800000;
          auVar237._0_8_ = 0xff800000ff800000;
          auVar237._12_4_ = 0xff800000;
          auVar237._16_4_ = 0xff800000;
          auVar237._20_4_ = 0xff800000;
          auVar237._24_4_ = 0xff800000;
          auVar237._28_4_ = 0xff800000;
          auVar240._8_4_ = 0x7f800000;
          auVar240._0_8_ = 0x7f8000007f800000;
          auVar240._12_4_ = 0x7f800000;
          auVar240._16_4_ = 0x7f800000;
          auVar240._20_4_ = 0x7f800000;
          auVar240._24_4_ = 0x7f800000;
          auVar240._28_4_ = 0x7f800000;
          auVar97 = vblendmps_avx512vl(auVar240,auVar237);
          bVar61 = (byte)uVar60;
          uVar73 = (uint)(bVar61 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar98._0_4_;
          bVar69 = (bool)((byte)(uVar60 >> 1) & 1);
          uVar138 = (uint)bVar69 * auVar97._4_4_ | (uint)!bVar69 * auVar98._4_4_;
          bVar69 = (bool)((byte)(uVar60 >> 2) & 1);
          uVar139 = (uint)bVar69 * auVar97._8_4_ | (uint)!bVar69 * auVar98._8_4_;
          bVar69 = (bool)((byte)(uVar60 >> 3) & 1);
          uVar140 = (uint)bVar69 * auVar97._12_4_ | (uint)!bVar69 * auVar98._12_4_;
          bVar69 = (bool)((byte)(uVar60 >> 4) & 1);
          uVar141 = (uint)bVar69 * auVar97._16_4_ | (uint)!bVar69 * auVar98._16_4_;
          bVar69 = (bool)((byte)(uVar60 >> 5) & 1);
          uVar142 = (uint)bVar69 * auVar97._20_4_ | (uint)!bVar69 * auVar98._20_4_;
          bVar69 = (bool)((byte)(uVar60 >> 6) & 1);
          uVar143 = (uint)bVar69 * auVar97._24_4_ | (uint)!bVar69 * auVar98._24_4_;
          bVar69 = SUB81(uVar60 >> 7,0);
          uVar144 = (uint)bVar69 * auVar97._28_4_ | (uint)!bVar69 * auVar98._28_4_;
          auVar131._0_4_ = (bVar56 & 1) * uVar73 | !(bool)(bVar56 & 1) * auVar131._0_4_;
          bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar131._4_4_ = bVar69 * uVar138 | !bVar69 * auVar131._4_4_;
          bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar131._8_4_ = bVar69 * uVar139 | !bVar69 * auVar131._8_4_;
          bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar131._12_4_ = bVar69 * uVar140 | !bVar69 * auVar131._12_4_;
          bVar69 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar131._16_4_ = bVar69 * uVar141 | !bVar69 * auVar131._16_4_;
          bVar69 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar131._20_4_ = bVar69 * uVar142 | !bVar69 * auVar131._20_4_;
          bVar69 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar131._24_4_ = bVar69 * uVar143 | !bVar69 * auVar131._24_4_;
          bVar69 = SUB81(uVar72 >> 7,0);
          auVar131._28_4_ = bVar69 * uVar144 | !bVar69 * auVar131._28_4_;
          auVar97 = vblendmps_avx512vl(auVar237,auVar240);
          bVar69 = (bool)((byte)(uVar60 >> 1) & 1);
          bVar5 = (bool)((byte)(uVar60 >> 2) & 1);
          bVar6 = (bool)((byte)(uVar60 >> 3) & 1);
          bVar7 = (bool)((byte)(uVar60 >> 4) & 1);
          bVar8 = (bool)((byte)(uVar60 >> 5) & 1);
          bVar9 = (bool)((byte)(uVar60 >> 6) & 1);
          bVar10 = SUB81(uVar60 >> 7,0);
          auVar132._0_4_ =
               (uint)(bVar56 & 1) *
               ((uint)(bVar61 & 1) * auVar97._0_4_ | !(bool)(bVar61 & 1) * uVar73) |
               !(bool)(bVar56 & 1) * auVar132._0_4_;
          bVar4 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar132._4_4_ =
               (uint)bVar4 * ((uint)bVar69 * auVar97._4_4_ | !bVar69 * uVar138) |
               !bVar4 * auVar132._4_4_;
          bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar132._8_4_ =
               (uint)bVar69 * ((uint)bVar5 * auVar97._8_4_ | !bVar5 * uVar139) |
               !bVar69 * auVar132._8_4_;
          bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar132._12_4_ =
               (uint)bVar69 * ((uint)bVar6 * auVar97._12_4_ | !bVar6 * uVar140) |
               !bVar69 * auVar132._12_4_;
          bVar69 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar132._16_4_ =
               (uint)bVar69 * ((uint)bVar7 * auVar97._16_4_ | !bVar7 * uVar141) |
               !bVar69 * auVar132._16_4_;
          bVar69 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar132._20_4_ =
               (uint)bVar69 * ((uint)bVar8 * auVar97._20_4_ | !bVar8 * uVar142) |
               !bVar69 * auVar132._20_4_;
          bVar69 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar132._24_4_ =
               (uint)bVar69 * ((uint)bVar9 * auVar97._24_4_ | !bVar9 * uVar143) |
               !bVar69 * auVar132._24_4_;
          bVar69 = SUB81(uVar72 >> 7,0);
          auVar132._28_4_ =
               (uint)bVar69 * ((uint)bVar10 * auVar97._28_4_ | !bVar10 * uVar144) |
               !bVar69 * auVar132._28_4_;
          bVar62 = (~bVar56 | bVar61) & bVar62;
        }
      }
      auVar97 = vmulps_avx512vl(local_740,auVar84);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar90,auVar83);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar89,auVar100);
      _local_500 = _local_7a0;
      local_4e0 = vminps_avx(local_5c0,auVar131);
      vandps_avx512vl(auVar97,auVar111);
      _local_6a0 = vmaxps_avx(_local_7a0,auVar132);
      _local_5e0 = _local_6a0;
      auVar205._8_4_ = 0x3e99999a;
      auVar205._0_8_ = 0x3e99999a3e99999a;
      auVar205._12_4_ = 0x3e99999a;
      auVar205._16_4_ = 0x3e99999a;
      auVar205._20_4_ = 0x3e99999a;
      auVar205._24_4_ = 0x3e99999a;
      auVar205._28_4_ = 0x3e99999a;
      uVar20 = vcmpps_avx512vl(auVar97,auVar205,1);
      uVar22 = vcmpps_avx512vl(_local_7a0,local_4e0,2);
      bVar56 = (byte)uVar22 & bVar59;
      uVar21 = vcmpps_avx512vl(_local_6a0,local_5c0,2);
      auVar245 = ZEXT3264(local_920);
      auVar246 = ZEXT3264(local_940);
      if ((bVar59 & ((byte)uVar21 | (byte)uVar22)) == 0) {
        auVar213 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        auVar165 = ZEXT3264(local_840);
        auVar220 = ZEXT3264(local_9c0);
      }
      else {
        auVar97 = vmulps_avx512vl(local_740,auVar99);
        auVar97 = vfmadd213ps_avx512vl(auVar103,auVar90,auVar97);
        auVar97 = vfmadd213ps_avx512vl(auVar101,auVar89,auVar97);
        vandps_avx512vl(auVar97,auVar111);
        uVar22 = vcmpps_avx512vl(auVar97,auVar205,1);
        bVar61 = (byte)uVar22 | ~bVar62;
        auVar159._8_4_ = 2;
        auVar159._0_8_ = 0x200000002;
        auVar159._12_4_ = 2;
        auVar159._16_4_ = 2;
        auVar159._20_4_ = 2;
        auVar159._24_4_ = 2;
        auVar159._28_4_ = 2;
        auVar34._8_4_ = 3;
        auVar34._0_8_ = 0x300000003;
        auVar34._12_4_ = 3;
        auVar34._16_4_ = 3;
        auVar34._20_4_ = 3;
        auVar34._24_4_ = 3;
        auVar34._28_4_ = 3;
        auVar97 = vpblendmd_avx512vl(auVar159,auVar34);
        local_5a0._0_4_ = (uint)(bVar61 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar61 & 1) * 2;
        bVar69 = (bool)(bVar61 >> 1 & 1);
        local_5a0._4_4_ = (uint)bVar69 * auVar97._4_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar61 >> 2 & 1);
        local_5a0._8_4_ = (uint)bVar69 * auVar97._8_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar61 >> 3 & 1);
        local_5a0._12_4_ = (uint)bVar69 * auVar97._12_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar61 >> 4 & 1);
        local_5a0._16_4_ = (uint)bVar69 * auVar97._16_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar61 >> 5 & 1);
        local_5a0._20_4_ = (uint)bVar69 * auVar97._20_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar61 >> 6 & 1);
        local_5a0._24_4_ = (uint)bVar69 * auVar97._24_4_ | (uint)!bVar69 * 2;
        local_5a0._28_4_ = (uint)(bVar61 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar61 >> 7) * 2;
        local_620 = vpbroadcastd_avx512vl();
        uVar22 = vpcmpd_avx512vl(local_620,local_5a0,5);
        bVar61 = (byte)uVar22 & bVar56;
        if (bVar61 == 0) {
          auVar216._8_4_ = 0x7fffffff;
          auVar216._0_8_ = 0x7fffffff7fffffff;
          auVar216._12_4_ = 0x7fffffff;
        }
        else {
          auVar77 = vminps_avx(local_7c0._0_16_,local_800._0_16_);
          auVar76 = vmaxps_avx(local_7c0._0_16_,local_800._0_16_);
          auVar74 = vminps_avx(local_7e0._0_16_,local_820._0_16_);
          auVar78 = vminps_avx(auVar77,auVar74);
          auVar77 = vmaxps_avx(local_7e0._0_16_,local_820._0_16_);
          auVar74 = vmaxps_avx(auVar76,auVar77);
          auVar188._8_4_ = 0x7fffffff;
          auVar188._0_8_ = 0x7fffffff7fffffff;
          auVar188._12_4_ = 0x7fffffff;
          auVar76 = vandps_avx(auVar78,auVar188);
          auVar77 = vandps_avx(auVar74,auVar188);
          auVar76 = vmaxps_avx(auVar76,auVar77);
          auVar77 = vmovshdup_avx(auVar76);
          auVar77 = vmaxss_avx(auVar77,auVar76);
          auVar76 = vshufpd_avx(auVar76,auVar76,1);
          auVar76 = vmaxss_avx(auVar76,auVar77);
          fVar225 = auVar76._0_4_ * 1.9073486e-06;
          local_8a0 = vshufps_avx(auVar74,auVar74,0xff);
          local_680 = (float)local_7a0._0_4_ + (float)local_720._0_4_;
          fStack_67c = (float)local_7a0._4_4_ + (float)local_720._4_4_;
          fStack_678 = fStack_798 + fStack_718;
          fStack_674 = fStack_794 + fStack_714;
          fStack_670 = fStack_790 + fStack_710;
          fStack_66c = fStack_78c + fStack_70c;
          fStack_668 = fStack_788 + fStack_708;
          fStack_664 = fStack_784 + fStack_704;
          do {
            auVar160._8_4_ = 0x7f800000;
            auVar160._0_8_ = 0x7f8000007f800000;
            auVar160._12_4_ = 0x7f800000;
            auVar160._16_4_ = 0x7f800000;
            auVar160._20_4_ = 0x7f800000;
            auVar160._24_4_ = 0x7f800000;
            auVar160._28_4_ = 0x7f800000;
            auVar97 = vblendmps_avx512vl(auVar160,_local_7a0);
            auVar133._0_4_ =
                 (uint)(bVar61 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar61 & 1) * 0x7f800000;
            bVar69 = (bool)(bVar61 >> 1 & 1);
            auVar133._4_4_ = (uint)bVar69 * auVar97._4_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar61 >> 2 & 1);
            auVar133._8_4_ = (uint)bVar69 * auVar97._8_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar61 >> 3 & 1);
            auVar133._12_4_ = (uint)bVar69 * auVar97._12_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar61 >> 4 & 1);
            auVar133._16_4_ = (uint)bVar69 * auVar97._16_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar61 >> 5 & 1);
            auVar133._20_4_ = (uint)bVar69 * auVar97._20_4_ | (uint)!bVar69 * 0x7f800000;
            auVar133._24_4_ =
                 (uint)(bVar61 >> 6) * auVar97._24_4_ | (uint)!(bool)(bVar61 >> 6) * 0x7f800000;
            auVar133._28_4_ = 0x7f800000;
            auVar97 = vshufps_avx(auVar133,auVar133,0xb1);
            auVar97 = vminps_avx(auVar133,auVar97);
            auVar83 = vshufpd_avx(auVar97,auVar97,5);
            auVar97 = vminps_avx(auVar97,auVar83);
            auVar83 = vpermpd_avx2(auVar97,0x4e);
            auVar97 = vminps_avx(auVar97,auVar83);
            uVar22 = vcmpps_avx512vl(auVar133,auVar97,0);
            bVar55 = (byte)uVar22 & bVar61;
            bVar63 = bVar61;
            if (bVar55 != 0) {
              bVar63 = bVar55;
            }
            iVar23 = 0;
            for (uVar73 = (uint)bVar63; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
              iVar23 = iVar23 + 1;
            }
            bVar63 = '\x01' << ((byte)iVar23 & 0x1f);
            uVar73 = *(uint *)(local_640 + (uint)(iVar23 << 2));
            fVar232 = *(float *)(local_500 + (uint)(iVar23 << 2));
            fVar233 = auVar18._0_4_;
            if ((float)local_970._0_4_ < 0.0) {
              fVar233 = sqrtf((float)local_970._0_4_);
            }
            auVar247 = ZEXT464(uVar73);
            bVar55 = ~bVar63;
            lVar67 = 5;
            do {
              auVar147._4_4_ = fVar232;
              auVar147._0_4_ = fVar232;
              auVar147._8_4_ = fVar232;
              auVar147._12_4_ = fVar232;
              auVar77 = vfmadd132ps_fma(auVar147,ZEXT816(0) << 0x40,local_950);
              fVar239 = auVar247._0_4_;
              fVar234 = 1.0 - fVar239;
              auVar189._0_4_ = local_800._0_4_ * fVar239;
              auVar189._4_4_ = local_800._4_4_ * fVar239;
              auVar189._8_4_ = local_800._8_4_ * fVar239;
              auVar189._12_4_ = local_800._12_4_ * fVar239;
              local_780._0_16_ = ZEXT416((uint)fVar234);
              auVar208._4_4_ = fVar234;
              auVar208._0_4_ = fVar234;
              auVar208._8_4_ = fVar234;
              auVar208._12_4_ = fVar234;
              auVar76 = vfmadd231ps_fma(auVar189,auVar208,local_7c0._0_16_);
              auVar214._0_4_ = local_7e0._0_4_ * fVar239;
              auVar214._4_4_ = local_7e0._4_4_ * fVar239;
              auVar214._8_4_ = local_7e0._8_4_ * fVar239;
              auVar214._12_4_ = local_7e0._12_4_ * fVar239;
              auVar74 = vfmadd231ps_fma(auVar214,auVar208,local_800._0_16_);
              auVar221._0_4_ = fVar239 * (float)local_820._0_4_;
              auVar221._4_4_ = fVar239 * (float)local_820._4_4_;
              auVar221._8_4_ = fVar239 * fStack_818;
              auVar221._12_4_ = fVar239 * fStack_814;
              auVar78 = vfmadd231ps_fma(auVar221,auVar208,local_7e0._0_16_);
              auVar228._0_4_ = fVar239 * auVar74._0_4_;
              auVar228._4_4_ = fVar239 * auVar74._4_4_;
              auVar228._8_4_ = fVar239 * auVar74._8_4_;
              auVar228._12_4_ = fVar239 * auVar74._12_4_;
              auVar76 = vfmadd231ps_fma(auVar228,auVar208,auVar76);
              auVar190._0_4_ = fVar239 * auVar78._0_4_;
              auVar190._4_4_ = fVar239 * auVar78._4_4_;
              auVar190._8_4_ = fVar239 * auVar78._8_4_;
              auVar190._12_4_ = fVar239 * auVar78._12_4_;
              auVar74 = vfmadd231ps_fma(auVar190,auVar208,auVar74);
              auVar215._0_4_ = fVar239 * auVar74._0_4_;
              auVar215._4_4_ = fVar239 * auVar74._4_4_;
              auVar215._8_4_ = fVar239 * auVar74._8_4_;
              auVar215._12_4_ = fVar239 * auVar74._12_4_;
              auVar78 = vfmadd231ps_fma(auVar215,auVar76,auVar208);
              auVar76 = vsubps_avx(auVar74,auVar76);
              auVar24._8_4_ = 0x40400000;
              auVar24._0_8_ = 0x4040000040400000;
              auVar24._12_4_ = 0x40400000;
              auVar74 = vmulps_avx512vl(auVar76,auVar24);
              local_760._0_16_ = auVar78;
              auVar76 = vsubps_avx(auVar77,auVar78);
              local_9a0._0_16_ = auVar76;
              auVar76 = vdpps_avx(auVar76,auVar76,0x7f);
              local_8e0._0_16_ = auVar76;
              if (auVar76._0_4_ < 0.0) {
                auVar165._0_4_ = sqrtf(auVar76._0_4_);
                auVar165._4_60_ = extraout_var;
                auVar76 = auVar165._0_16_;
              }
              else {
                auVar76 = vsqrtss_avx(auVar76,auVar76);
              }
              local_850 = vdpps_avx(auVar74,auVar74,0x7f);
              fVar234 = local_850._0_4_;
              auVar191._4_12_ = ZEXT812(0) << 0x20;
              auVar191._0_4_ = fVar234;
              auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar191);
              fVar146 = auVar77._0_4_;
              local_860 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar191);
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar78 = vxorps_avx512vl(local_850,auVar25);
              auVar77 = vfnmadd213ss_fma(local_860,local_850,ZEXT416(0x40000000));
              local_900._0_4_ = auVar76._0_4_;
              if (fVar234 < auVar78._0_4_) {
                fVar235 = sqrtf(fVar234);
                auVar76 = ZEXT416((uint)local_900._0_4_);
              }
              else {
                auVar78 = vsqrtss_avx(local_850,local_850);
                fVar235 = auVar78._0_4_;
              }
              local_960._0_4_ = fVar235;
              fVar234 = fVar146 * 1.5 + fVar234 * -0.5 * fVar146 * fVar146 * fVar146;
              local_870._0_4_ = auVar74._0_4_ * fVar234;
              local_870._4_4_ = auVar74._4_4_ * fVar234;
              local_870._8_4_ = auVar74._8_4_ * fVar234;
              local_870._12_4_ = auVar74._12_4_ * fVar234;
              auVar78 = vdpps_avx(local_9a0._0_16_,local_870,0x7f);
              auVar75 = vaddss_avx512f(auVar76,ZEXT416(0x3f800000));
              auVar148._0_4_ = auVar78._0_4_ * auVar78._0_4_;
              auVar148._4_4_ = auVar78._4_4_ * auVar78._4_4_;
              auVar148._8_4_ = auVar78._8_4_ * auVar78._8_4_;
              auVar148._12_4_ = auVar78._12_4_ * auVar78._12_4_;
              auVar81 = vsubps_avx(local_8e0._0_16_,auVar148);
              fVar146 = auVar81._0_4_;
              auVar168._4_12_ = ZEXT812(0) << 0x20;
              auVar168._0_4_ = fVar146;
              auVar79 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar168);
              fVar235 = auVar79._0_4_;
              uVar70 = fVar146 == 0.0;
              uVar68 = fVar146 < 0.0;
              if ((bool)uVar68) {
                local_880 = fVar234;
                fStack_87c = fVar234;
                fStack_878 = fVar234;
                fStack_874 = fVar234;
                fVar207 = sqrtf(fVar146);
                auVar76 = ZEXT416((uint)local_900._0_4_);
                auVar75 = ZEXT416(auVar75._0_4_);
                fVar234 = local_880;
                fVar236 = fStack_87c;
                fVar243 = fStack_878;
                fVar167 = fStack_874;
              }
              else {
                auVar81 = vsqrtss_avx(auVar81,auVar81);
                fVar207 = auVar81._0_4_;
                fVar236 = fVar234;
                fVar243 = fVar234;
                fVar167 = fVar234;
              }
              auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar247._0_16_,
                                        local_780._0_16_);
              fVar166 = auVar81._0_4_ * 6.0;
              fVar19 = fVar239 * 6.0;
              auVar192._0_4_ = fVar19 * (float)local_820._0_4_;
              auVar192._4_4_ = fVar19 * (float)local_820._4_4_;
              auVar192._8_4_ = fVar19 * fStack_818;
              auVar192._12_4_ = fVar19 * fStack_814;
              auVar169._4_4_ = fVar166;
              auVar169._0_4_ = fVar166;
              auVar169._8_4_ = fVar166;
              auVar169._12_4_ = fVar166;
              auVar81 = vfmadd132ps_fma(auVar169,auVar192,local_7e0._0_16_);
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_780._0_16_,
                                        auVar247._0_16_);
              fVar166 = auVar79._0_4_ * 6.0;
              auVar193._4_4_ = fVar166;
              auVar193._0_4_ = fVar166;
              auVar193._8_4_ = fVar166;
              auVar193._12_4_ = fVar166;
              auVar81 = vfmadd132ps_fma(auVar193,auVar81,local_800._0_16_);
              fVar166 = local_780._0_4_ * 6.0;
              auVar170._4_4_ = fVar166;
              auVar170._0_4_ = fVar166;
              auVar170._8_4_ = fVar166;
              auVar170._12_4_ = fVar166;
              auVar81 = vfmadd132ps_fma(auVar170,auVar81,local_7c0._0_16_);
              auVar194._0_4_ = auVar81._0_4_ * (float)local_850._0_4_;
              auVar194._4_4_ = auVar81._4_4_ * (float)local_850._0_4_;
              auVar194._8_4_ = auVar81._8_4_ * (float)local_850._0_4_;
              auVar194._12_4_ = auVar81._12_4_ * (float)local_850._0_4_;
              auVar81 = vdpps_avx(auVar74,auVar81,0x7f);
              fVar166 = auVar81._0_4_;
              auVar171._0_4_ = auVar74._0_4_ * fVar166;
              auVar171._4_4_ = auVar74._4_4_ * fVar166;
              auVar171._8_4_ = auVar74._8_4_ * fVar166;
              auVar171._12_4_ = auVar74._12_4_ * fVar166;
              auVar81 = vsubps_avx(auVar194,auVar171);
              fVar166 = auVar77._0_4_ * (float)local_860._0_4_;
              auVar79 = vmaxss_avx(ZEXT416((uint)fVar225),
                                   ZEXT416((uint)(fVar232 * fVar233 * 1.9073486e-06)));
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar80 = vxorps_avx512vl(auVar74,auVar26);
              auVar195._0_4_ = fVar234 * auVar81._0_4_ * fVar166;
              auVar195._4_4_ = fVar236 * auVar81._4_4_ * fVar166;
              auVar195._8_4_ = fVar243 * auVar81._8_4_ * fVar166;
              auVar195._12_4_ = fVar167 * auVar81._12_4_ * fVar166;
              auVar77 = vdpps_avx(auVar80,local_870,0x7f);
              auVar81 = vfmadd213ss_fma(auVar76,ZEXT416((uint)fVar225),auVar79);
              auVar76 = vdpps_avx(local_9a0._0_16_,auVar195,0x7f);
              vfmadd213ss_avx512f(auVar75,ZEXT416((uint)(fVar225 / (float)local_960._0_4_)),auVar81)
              ;
              fVar234 = auVar77._0_4_ + auVar76._0_4_;
              auVar76 = vdpps_avx(local_950,local_870,0x7f);
              auVar77 = vdpps_avx(local_9a0._0_16_,auVar80,0x7f);
              fVar146 = fVar235 * fVar146 * -0.5 * fVar235 * fVar235 + fVar235 * 1.5;
              auVar81 = vdpps_avx(local_9a0._0_16_,local_950,0x7f);
              auVar75 = vfnmadd231ss_avx512f(auVar77,auVar78,ZEXT416((uint)fVar234));
              auVar80 = vfnmadd231ss_avx512f(auVar81,auVar78,auVar76);
              auVar77 = vpermilps_avx(local_760._0_16_,0xff);
              fVar207 = fVar207 - auVar77._0_4_;
              auVar77 = vshufps_avx(auVar74,auVar74,0xff);
              auVar81 = vfmsub213ss_fma(auVar75,ZEXT416((uint)fVar146),auVar77);
              fVar146 = auVar80._0_4_ * fVar146;
              auVar75 = vfmsub231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar81._0_4_)),
                                        ZEXT416((uint)fVar234),ZEXT416((uint)fVar146));
              fVar235 = auVar75._0_4_;
              auVar229._0_4_ = fVar146 / fVar235;
              auVar229._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar209._0_4_ = auVar81._0_4_ / fVar235;
              auVar209._4_12_ = auVar81._4_12_;
              auVar81 = vmulss_avx512f(auVar78,auVar229);
              auVar75 = vmulss_avx512f(auVar78,auVar209);
              fVar239 = fVar239 - (auVar81._0_4_ - fVar207 * (auVar76._0_4_ / fVar235));
              auVar247 = ZEXT464((uint)fVar239);
              fVar232 = fVar232 - (fVar207 * (fVar234 / fVar235) - auVar75._0_4_);
              auVar216._8_4_ = 0x7fffffff;
              auVar216._0_8_ = 0x7fffffff7fffffff;
              auVar216._12_4_ = 0x7fffffff;
              auVar76 = vandps_avx512vl(auVar78,auVar216);
              auVar76 = vucomiss_avx512f(auVar76);
              in_ZMM31 = ZEXT1664(auVar76);
              bVar69 = true;
              if (!(bool)uVar68 && !(bool)uVar70) {
                auVar76 = vaddss_avx512f(auVar79,auVar76);
                auVar78 = vfmadd231ss_fma(auVar76,local_8a0,ZEXT416(0x36000000));
                auVar76 = vandps_avx(ZEXT416((uint)fVar207),auVar216);
                if (auVar76._0_4_ < auVar78._0_4_) {
                  fVar232 = fVar232 + (float)local_890._0_4_;
                  if ((((fVar145 <= fVar232) &&
                       (fVar234 = *(float *)(ray + k * 4 + 0x200), fVar232 <= fVar234)) &&
                      (0.0 <= fVar239)) && (fVar239 <= 1.0)) {
                    auVar50._12_4_ = 0;
                    auVar50._0_12_ = ZEXT812(0);
                    auVar76 = vrsqrt14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)local_8e0._0_4_));
                    fVar146 = auVar76._0_4_;
                    pGVar2 = (context->scene->geometries).items[uVar64].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar63 = true;
                      }
                      else {
                        fVar146 = fVar146 * 1.5 +
                                  (float)local_8e0._0_4_ * -0.5 * fVar146 * fVar146 * fVar146;
                        auVar172._0_4_ = local_9a0._0_4_ * fVar146;
                        auVar172._4_4_ = local_9a0._4_4_ * fVar146;
                        auVar172._8_4_ = local_9a0._8_4_ * fVar146;
                        auVar172._12_4_ = local_9a0._12_4_ * fVar146;
                        auVar78 = vfmadd213ps_fma(auVar77,auVar172,auVar74);
                        auVar76 = vshufps_avx(auVar172,auVar172,0xc9);
                        auVar77 = vshufps_avx(auVar74,auVar74,0xc9);
                        auVar173._0_4_ = auVar172._0_4_ * auVar77._0_4_;
                        auVar173._4_4_ = auVar172._4_4_ * auVar77._4_4_;
                        auVar173._8_4_ = auVar172._8_4_ * auVar77._8_4_;
                        auVar173._12_4_ = auVar172._12_4_ * auVar77._12_4_;
                        auVar74 = vfmsub231ps_fma(auVar173,auVar74,auVar76);
                        auVar76 = vshufps_avx(auVar74,auVar74,0xc9);
                        auVar77 = vshufps_avx(auVar78,auVar78,0xc9);
                        auVar74 = vshufps_avx(auVar74,auVar74,0xd2);
                        auVar149._0_4_ = auVar78._0_4_ * auVar74._0_4_;
                        auVar149._4_4_ = auVar78._4_4_ * auVar74._4_4_;
                        auVar149._8_4_ = auVar78._8_4_ * auVar74._8_4_;
                        auVar149._12_4_ = auVar78._12_4_ * auVar74._12_4_;
                        auVar76 = vfmsub231ps_fma(auVar149,auVar76,auVar77);
                        auVar77 = ZEXT416((uint)fVar239);
                        local_340 = vbroadcastss_avx512f(auVar77);
                        auVar165 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar165 = vpermps_avx512f(auVar165,ZEXT1664(auVar76));
                        auVar213 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar213,ZEXT1664(auVar76));
                        local_380 = vbroadcastss_avx512f(auVar76);
                        local_400[0] = (RTCHitN)auVar165[0];
                        local_400[1] = (RTCHitN)auVar165[1];
                        local_400[2] = (RTCHitN)auVar165[2];
                        local_400[3] = (RTCHitN)auVar165[3];
                        local_400[4] = (RTCHitN)auVar165[4];
                        local_400[5] = (RTCHitN)auVar165[5];
                        local_400[6] = (RTCHitN)auVar165[6];
                        local_400[7] = (RTCHitN)auVar165[7];
                        local_400[8] = (RTCHitN)auVar165[8];
                        local_400[9] = (RTCHitN)auVar165[9];
                        local_400[10] = (RTCHitN)auVar165[10];
                        local_400[0xb] = (RTCHitN)auVar165[0xb];
                        local_400[0xc] = (RTCHitN)auVar165[0xc];
                        local_400[0xd] = (RTCHitN)auVar165[0xd];
                        local_400[0xe] = (RTCHitN)auVar165[0xe];
                        local_400[0xf] = (RTCHitN)auVar165[0xf];
                        local_400[0x10] = (RTCHitN)auVar165[0x10];
                        local_400[0x11] = (RTCHitN)auVar165[0x11];
                        local_400[0x12] = (RTCHitN)auVar165[0x12];
                        local_400[0x13] = (RTCHitN)auVar165[0x13];
                        local_400[0x14] = (RTCHitN)auVar165[0x14];
                        local_400[0x15] = (RTCHitN)auVar165[0x15];
                        local_400[0x16] = (RTCHitN)auVar165[0x16];
                        local_400[0x17] = (RTCHitN)auVar165[0x17];
                        local_400[0x18] = (RTCHitN)auVar165[0x18];
                        local_400[0x19] = (RTCHitN)auVar165[0x19];
                        local_400[0x1a] = (RTCHitN)auVar165[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar165[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar165[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar165[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar165[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar165[0x1f];
                        local_400[0x20] = (RTCHitN)auVar165[0x20];
                        local_400[0x21] = (RTCHitN)auVar165[0x21];
                        local_400[0x22] = (RTCHitN)auVar165[0x22];
                        local_400[0x23] = (RTCHitN)auVar165[0x23];
                        local_400[0x24] = (RTCHitN)auVar165[0x24];
                        local_400[0x25] = (RTCHitN)auVar165[0x25];
                        local_400[0x26] = (RTCHitN)auVar165[0x26];
                        local_400[0x27] = (RTCHitN)auVar165[0x27];
                        local_400[0x28] = (RTCHitN)auVar165[0x28];
                        local_400[0x29] = (RTCHitN)auVar165[0x29];
                        local_400[0x2a] = (RTCHitN)auVar165[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar165[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar165[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar165[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar165[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar165[0x2f];
                        local_400[0x30] = (RTCHitN)auVar165[0x30];
                        local_400[0x31] = (RTCHitN)auVar165[0x31];
                        local_400[0x32] = (RTCHitN)auVar165[0x32];
                        local_400[0x33] = (RTCHitN)auVar165[0x33];
                        local_400[0x34] = (RTCHitN)auVar165[0x34];
                        local_400[0x35] = (RTCHitN)auVar165[0x35];
                        local_400[0x36] = (RTCHitN)auVar165[0x36];
                        local_400[0x37] = (RTCHitN)auVar165[0x37];
                        local_400[0x38] = (RTCHitN)auVar165[0x38];
                        local_400[0x39] = (RTCHitN)auVar165[0x39];
                        local_400[0x3a] = (RTCHitN)auVar165[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar165[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar165[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar165[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar165[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar165[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_440._0_8_;
                        uStack_2b8 = local_440._8_8_;
                        uStack_2b0 = local_440._16_8_;
                        uStack_2a8 = local_440._24_8_;
                        uStack_2a0 = local_440._32_8_;
                        uStack_298 = local_440._40_8_;
                        uStack_290 = local_440._48_8_;
                        uStack_288 = local_440._56_8_;
                        auVar165 = vmovdqa64_avx512f(local_480);
                        local_280 = vmovdqa64_avx512f(auVar165);
                        vpcmpeqd_avx2(auVar165._0_32_,auVar165._0_32_);
                        local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar232;
                        local_700 = local_4c0;
                        local_9f0.valid = (int *)local_700;
                        local_9f0.geometryUserPtr = pGVar2->userPtr;
                        local_9f0.context = context->user;
                        local_9f0.hit = local_400;
                        local_9f0.N = 0x10;
                        local_9f0.ray = (RTCRayN *)ray;
                        if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar2->occlusionFilterN)(&local_9f0);
                          auVar247 = ZEXT1664(auVar77);
                          auVar216._8_4_ = 0x7fffffff;
                          auVar216._0_8_ = 0x7fffffff7fffffff;
                          auVar216._12_4_ = 0x7fffffff;
                          auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        }
                        auVar165 = vmovdqa64_avx512f(local_700);
                        uVar22 = vptestmd_avx512f(auVar165,auVar165);
                        if ((short)uVar22 == 0) {
                          bVar63 = false;
                        }
                        else {
                          p_Var3 = context->args->filter;
                          if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var3)(&local_9f0);
                            auVar247 = ZEXT1664(auVar77);
                            auVar216._8_4_ = 0x7fffffff;
                            auVar216._0_8_ = 0x7fffffff7fffffff;
                            auVar216._12_4_ = 0x7fffffff;
                            auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          }
                          auVar165 = vmovdqa64_avx512f(local_700);
                          uVar72 = vptestmd_avx512f(auVar165,auVar165);
                          auVar165 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar69 = (bool)((byte)uVar72 & 1);
                          auVar213._0_4_ =
                               (uint)bVar69 * auVar165._0_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x200);
                          bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
                          auVar213._4_4_ =
                               (uint)bVar69 * auVar165._4_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x204);
                          bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
                          auVar213._8_4_ =
                               (uint)bVar69 * auVar165._8_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x208);
                          bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
                          auVar213._12_4_ =
                               (uint)bVar69 * auVar165._12_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x20c);
                          bVar69 = (bool)((byte)(uVar72 >> 4) & 1);
                          auVar213._16_4_ =
                               (uint)bVar69 * auVar165._16_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x210);
                          bVar69 = (bool)((byte)(uVar72 >> 5) & 1);
                          auVar213._20_4_ =
                               (uint)bVar69 * auVar165._20_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x214);
                          bVar69 = (bool)((byte)(uVar72 >> 6) & 1);
                          auVar213._24_4_ =
                               (uint)bVar69 * auVar165._24_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x218);
                          bVar69 = (bool)((byte)(uVar72 >> 7) & 1);
                          auVar213._28_4_ =
                               (uint)bVar69 * auVar165._28_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x21c);
                          bVar69 = (bool)((byte)(uVar72 >> 8) & 1);
                          auVar213._32_4_ =
                               (uint)bVar69 * auVar165._32_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x220);
                          bVar69 = (bool)((byte)(uVar72 >> 9) & 1);
                          auVar213._36_4_ =
                               (uint)bVar69 * auVar165._36_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x224);
                          bVar69 = (bool)((byte)(uVar72 >> 10) & 1);
                          auVar213._40_4_ =
                               (uint)bVar69 * auVar165._40_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x228);
                          bVar69 = (bool)((byte)(uVar72 >> 0xb) & 1);
                          auVar213._44_4_ =
                               (uint)bVar69 * auVar165._44_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x22c);
                          bVar69 = (bool)((byte)(uVar72 >> 0xc) & 1);
                          auVar213._48_4_ =
                               (uint)bVar69 * auVar165._48_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x230);
                          bVar69 = (bool)((byte)(uVar72 >> 0xd) & 1);
                          auVar213._52_4_ =
                               (uint)bVar69 * auVar165._52_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x234);
                          bVar69 = (bool)((byte)(uVar72 >> 0xe) & 1);
                          auVar213._56_4_ =
                               (uint)bVar69 * auVar165._56_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x238);
                          bVar69 = SUB81(uVar72 >> 0xf,0);
                          auVar213._60_4_ =
                               (uint)bVar69 * auVar165._60_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x23c);
                          *(undefined1 (*) [64])(local_9f0.ray + 0x200) = auVar213;
                          bVar63 = (short)uVar72 != 0;
                        }
                        if ((bool)bVar63 == false) {
                          *(float *)(ray + k * 4 + 0x200) = fVar234;
                        }
                      }
                      bVar69 = false;
                      goto LAB_01d1598b;
                    }
                  }
                  bVar69 = false;
                  bVar63 = 0;
                }
              }
LAB_01d1598b:
              if (!bVar69) goto LAB_01d15da7;
              lVar67 = lVar67 + -1;
            } while (lVar67 != 0);
            bVar63 = 0;
LAB_01d15da7:
            bVar58 = bVar58 | bVar63 & 1;
            auVar52._4_4_ = fStack_67c;
            auVar52._0_4_ = local_680;
            auVar52._8_4_ = fStack_678;
            auVar52._12_4_ = fStack_674;
            auVar52._16_4_ = fStack_670;
            auVar52._20_4_ = fStack_66c;
            auVar52._24_4_ = fStack_668;
            auVar52._28_4_ = fStack_664;
            uVar224 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar35._4_4_ = uVar224;
            auVar35._0_4_ = uVar224;
            auVar35._8_4_ = uVar224;
            auVar35._12_4_ = uVar224;
            auVar35._16_4_ = uVar224;
            auVar35._20_4_ = uVar224;
            auVar35._24_4_ = uVar224;
            auVar35._28_4_ = uVar224;
            uVar22 = vcmpps_avx512vl(auVar52,auVar35,2);
            bVar61 = bVar55 & bVar61 & (byte)uVar22;
            auVar247 = ZEXT3264(auVar97);
          } while (bVar61 != 0);
        }
        auVar161._0_4_ = (float)local_720._0_4_ + (float)local_6a0._0_4_;
        auVar161._4_4_ = (float)local_720._4_4_ + (float)local_6a0._4_4_;
        auVar161._8_4_ = fStack_718 + fStack_698;
        auVar161._12_4_ = fStack_714 + fStack_694;
        auVar161._16_4_ = fStack_710 + fStack_690;
        auVar161._20_4_ = fStack_70c + fStack_68c;
        auVar161._24_4_ = fStack_708 + fStack_688;
        auVar161._28_4_ = fStack_704 + fStack_684;
        uVar224 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar36._4_4_ = uVar224;
        auVar36._0_4_ = uVar224;
        auVar36._8_4_ = uVar224;
        auVar36._12_4_ = uVar224;
        auVar36._16_4_ = uVar224;
        auVar36._20_4_ = uVar224;
        auVar36._24_4_ = uVar224;
        auVar36._28_4_ = uVar224;
        uVar22 = vcmpps_avx512vl(auVar161,auVar36,2);
        bVar62 = (byte)uVar20 | ~bVar62;
        bVar59 = (byte)uVar21 & bVar59 & (byte)uVar22;
        auVar162._8_4_ = 2;
        auVar162._0_8_ = 0x200000002;
        auVar162._12_4_ = 2;
        auVar162._16_4_ = 2;
        auVar162._20_4_ = 2;
        auVar162._24_4_ = 2;
        auVar162._28_4_ = 2;
        auVar37._8_4_ = 3;
        auVar37._0_8_ = 0x300000003;
        auVar37._12_4_ = 3;
        auVar37._16_4_ = 3;
        auVar37._20_4_ = 3;
        auVar37._24_4_ = 3;
        auVar37._28_4_ = 3;
        auVar97 = vpblendmd_avx512vl(auVar162,auVar37);
        local_6a0._0_4_ = (uint)(bVar62 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar62 & 1) * 2;
        bVar69 = (bool)(bVar62 >> 1 & 1);
        local_6a0._4_4_ = (uint)bVar69 * auVar97._4_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar62 >> 2 & 1);
        fStack_698 = (float)((uint)bVar69 * auVar97._8_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)(bVar62 >> 3 & 1);
        fStack_694 = (float)((uint)bVar69 * auVar97._12_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)(bVar62 >> 4 & 1);
        fStack_690 = (float)((uint)bVar69 * auVar97._16_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)(bVar62 >> 5 & 1);
        fStack_68c = (float)((uint)bVar69 * auVar97._20_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)(bVar62 >> 6 & 1);
        fStack_688 = (float)((uint)bVar69 * auVar97._24_4_ | (uint)!bVar69 * 2);
        fStack_684 = (float)((uint)(bVar62 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar62 >> 7) * 2);
        uVar20 = vpcmpd_avx512vl(_local_6a0,local_620,2);
        bVar62 = (byte)uVar20 & bVar59;
        if (bVar62 == 0) {
          auVar220 = ZEXT3264(local_9c0);
          auVar245 = ZEXT3264(local_920);
          auVar246 = ZEXT3264(local_940);
        }
        else {
          auVar77 = vminps_avx(local_7c0._0_16_,local_800._0_16_);
          auVar76 = vmaxps_avx(local_7c0._0_16_,local_800._0_16_);
          auVar74 = vminps_avx(local_7e0._0_16_,local_820._0_16_);
          auVar78 = vminps_avx(auVar77,auVar74);
          auVar77 = vmaxps_avx(local_7e0._0_16_,local_820._0_16_);
          auVar74 = vmaxps_avx(auVar76,auVar77);
          auVar76 = vandps_avx(auVar78,auVar216);
          auVar77 = vandps_avx(auVar74,auVar216);
          auVar76 = vmaxps_avx(auVar76,auVar77);
          auVar77 = vmovshdup_avx(auVar76);
          auVar77 = vmaxss_avx(auVar77,auVar76);
          auVar76 = vshufpd_avx(auVar76,auVar76,1);
          auVar76 = vmaxss_avx(auVar76,auVar77);
          fVar225 = auVar76._0_4_ * 1.9073486e-06;
          local_8a0 = vshufps_avx(auVar74,auVar74,0xff);
          _local_7a0 = _local_5e0;
          local_680 = (float)local_720._0_4_ + (float)local_5e0._0_4_;
          fStack_67c = (float)local_720._4_4_ + (float)local_5e0._4_4_;
          fStack_678 = fStack_718 + fStack_5d8;
          fStack_674 = fStack_714 + fStack_5d4;
          fStack_670 = fStack_710 + fStack_5d0;
          fStack_66c = fStack_70c + fStack_5cc;
          fStack_668 = fStack_708 + fStack_5c8;
          fStack_664 = fStack_704 + fStack_5c4;
          do {
            auVar163._8_4_ = 0x7f800000;
            auVar163._0_8_ = 0x7f8000007f800000;
            auVar163._12_4_ = 0x7f800000;
            auVar163._16_4_ = 0x7f800000;
            auVar163._20_4_ = 0x7f800000;
            auVar163._24_4_ = 0x7f800000;
            auVar163._28_4_ = 0x7f800000;
            auVar97 = vblendmps_avx512vl(auVar163,_local_7a0);
            auVar134._0_4_ =
                 (uint)(bVar62 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar62 & 1) * 0x7f800000;
            bVar69 = (bool)(bVar62 >> 1 & 1);
            auVar134._4_4_ = (uint)bVar69 * auVar97._4_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar62 >> 2 & 1);
            auVar134._8_4_ = (uint)bVar69 * auVar97._8_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar62 >> 3 & 1);
            auVar134._12_4_ = (uint)bVar69 * auVar97._12_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar62 >> 4 & 1);
            auVar134._16_4_ = (uint)bVar69 * auVar97._16_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar62 >> 5 & 1);
            auVar134._20_4_ = (uint)bVar69 * auVar97._20_4_ | (uint)!bVar69 * 0x7f800000;
            auVar134._24_4_ =
                 (uint)(bVar62 >> 6) * auVar97._24_4_ | (uint)!(bool)(bVar62 >> 6) * 0x7f800000;
            auVar134._28_4_ = 0x7f800000;
            auVar97 = vshufps_avx(auVar134,auVar134,0xb1);
            auVar97 = vminps_avx(auVar134,auVar97);
            auVar83 = vshufpd_avx(auVar97,auVar97,5);
            auVar97 = vminps_avx(auVar97,auVar83);
            auVar83 = vpermpd_avx2(auVar97,0x4e);
            auVar97 = vminps_avx(auVar97,auVar83);
            uVar20 = vcmpps_avx512vl(auVar134,auVar97,0);
            bVar63 = (byte)uVar20 & bVar62;
            bVar61 = bVar62;
            if (bVar63 != 0) {
              bVar61 = bVar63;
            }
            iVar23 = 0;
            for (uVar73 = (uint)bVar61; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
              iVar23 = iVar23 + 1;
            }
            bVar61 = '\x01' << ((byte)iVar23 & 0x1f);
            uVar73 = *(uint *)(local_660 + (uint)(iVar23 << 2));
            fVar232 = *(float *)(local_5c0 + (uint)(iVar23 << 2));
            fVar233 = auVar17._0_4_;
            if ((float)local_970._0_4_ < 0.0) {
              fVar233 = sqrtf((float)local_970._0_4_);
            }
            auVar165 = ZEXT464(uVar73);
            bVar63 = ~bVar61;
            lVar67 = 5;
            do {
              auVar150._4_4_ = fVar232;
              auVar150._0_4_ = fVar232;
              auVar150._8_4_ = fVar232;
              auVar150._12_4_ = fVar232;
              auVar77 = vfmadd132ps_fma(auVar150,ZEXT816(0) << 0x40,local_950);
              fVar239 = auVar165._0_4_;
              fVar234 = 1.0 - fVar239;
              auVar196._0_4_ = local_800._0_4_ * fVar239;
              auVar196._4_4_ = local_800._4_4_ * fVar239;
              auVar196._8_4_ = local_800._8_4_ * fVar239;
              auVar196._12_4_ = local_800._12_4_ * fVar239;
              local_780._0_16_ = ZEXT416((uint)fVar234);
              auVar210._4_4_ = fVar234;
              auVar210._0_4_ = fVar234;
              auVar210._8_4_ = fVar234;
              auVar210._12_4_ = fVar234;
              auVar76 = vfmadd231ps_fma(auVar196,auVar210,local_7c0._0_16_);
              auVar217._0_4_ = local_7e0._0_4_ * fVar239;
              auVar217._4_4_ = local_7e0._4_4_ * fVar239;
              auVar217._8_4_ = local_7e0._8_4_ * fVar239;
              auVar217._12_4_ = local_7e0._12_4_ * fVar239;
              auVar74 = vfmadd231ps_fma(auVar217,auVar210,local_800._0_16_);
              auVar222._0_4_ = fVar239 * (float)local_820._0_4_;
              auVar222._4_4_ = fVar239 * (float)local_820._4_4_;
              auVar222._8_4_ = fVar239 * fStack_818;
              auVar222._12_4_ = fVar239 * fStack_814;
              auVar78 = vfmadd231ps_fma(auVar222,auVar210,local_7e0._0_16_);
              auVar230._0_4_ = fVar239 * auVar74._0_4_;
              auVar230._4_4_ = fVar239 * auVar74._4_4_;
              auVar230._8_4_ = fVar239 * auVar74._8_4_;
              auVar230._12_4_ = fVar239 * auVar74._12_4_;
              auVar76 = vfmadd231ps_fma(auVar230,auVar210,auVar76);
              auVar197._0_4_ = fVar239 * auVar78._0_4_;
              auVar197._4_4_ = fVar239 * auVar78._4_4_;
              auVar197._8_4_ = fVar239 * auVar78._8_4_;
              auVar197._12_4_ = fVar239 * auVar78._12_4_;
              auVar74 = vfmadd231ps_fma(auVar197,auVar210,auVar74);
              auVar218._0_4_ = fVar239 * auVar74._0_4_;
              auVar218._4_4_ = fVar239 * auVar74._4_4_;
              auVar218._8_4_ = fVar239 * auVar74._8_4_;
              auVar218._12_4_ = fVar239 * auVar74._12_4_;
              auVar78 = vfmadd231ps_fma(auVar218,auVar76,auVar210);
              auVar76 = vsubps_avx(auVar74,auVar76);
              auVar27._8_4_ = 0x40400000;
              auVar27._0_8_ = 0x4040000040400000;
              auVar27._12_4_ = 0x40400000;
              auVar74 = vmulps_avx512vl(auVar76,auVar27);
              local_760._0_16_ = auVar78;
              auVar76 = vsubps_avx(auVar77,auVar78);
              local_9a0._0_16_ = auVar76;
              auVar76 = vdpps_avx(auVar76,auVar76,0x7f);
              local_8e0._0_16_ = auVar76;
              if (auVar76._0_4_ < 0.0) {
                auVar220._0_4_ = sqrtf(auVar76._0_4_);
                auVar220._4_60_ = extraout_var_00;
                auVar76 = auVar220._0_16_;
              }
              else {
                auVar76 = vsqrtss_avx(auVar76,auVar76);
              }
              local_850 = vdpps_avx(auVar74,auVar74,0x7f);
              fVar234 = local_850._0_4_;
              auVar198._4_12_ = ZEXT812(0) << 0x20;
              auVar198._0_4_ = fVar234;
              auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar198);
              fVar146 = auVar77._0_4_;
              local_960 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar198);
              auVar28._8_4_ = 0x80000000;
              auVar28._0_8_ = 0x8000000080000000;
              auVar28._12_4_ = 0x80000000;
              auVar78 = vxorps_avx512vl(local_850,auVar28);
              auVar77 = vfnmadd213ss_fma(local_960,local_850,ZEXT416(0x40000000));
              local_860._0_4_ = auVar77._0_4_;
              local_900._0_4_ = auVar76._0_4_;
              if (fVar234 < auVar78._0_4_) {
                auVar245._0_4_ = sqrtf(fVar234);
                auVar245._4_60_ = extraout_var_01;
                auVar76 = ZEXT416((uint)local_900._0_4_);
                auVar77 = auVar245._0_16_;
              }
              else {
                auVar77 = vsqrtss_avx512f(local_850,local_850);
              }
              fVar234 = fVar146 * 1.5 + fVar234 * -0.5 * fVar146 * fVar146 * fVar146;
              auVar151._0_4_ = auVar74._0_4_ * fVar234;
              auVar151._4_4_ = auVar74._4_4_ * fVar234;
              auVar151._8_4_ = auVar74._8_4_ * fVar234;
              auVar151._12_4_ = auVar74._12_4_ * fVar234;
              auVar78 = vdpps_avx(local_9a0._0_16_,auVar151,0x7f);
              auVar75 = vaddss_avx512f(auVar76,ZEXT416(0x3f800000));
              auVar152._0_4_ = auVar78._0_4_ * auVar78._0_4_;
              auVar152._4_4_ = auVar78._4_4_ * auVar78._4_4_;
              auVar152._8_4_ = auVar78._8_4_ * auVar78._8_4_;
              auVar152._12_4_ = auVar78._12_4_ * auVar78._12_4_;
              auVar81 = vsubps_avx(local_8e0._0_16_,auVar152);
              fVar146 = auVar81._0_4_;
              auVar174._4_12_ = ZEXT812(0) << 0x20;
              auVar174._0_4_ = fVar146;
              auVar79 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
              fVar235 = auVar79._0_4_;
              local_870._0_4_ = fVar146 * -0.5;
              uVar70 = fVar146 == 0.0;
              uVar68 = fVar146 < 0.0;
              if ((bool)uVar68) {
                local_880 = fVar234;
                fStack_87c = fVar234;
                fStack_878 = fVar234;
                fStack_874 = fVar234;
                fVar146 = sqrtf(fVar146);
                auVar77 = ZEXT416(auVar77._0_4_);
                auVar76 = ZEXT416((uint)local_900._0_4_);
                auVar75 = ZEXT416(auVar75._0_4_);
                fVar234 = local_880;
                fVar207 = fStack_87c;
                fVar236 = fStack_878;
                fVar243 = fStack_874;
              }
              else {
                auVar81 = vsqrtss_avx(auVar81,auVar81);
                fVar146 = auVar81._0_4_;
                fVar207 = fVar234;
                fVar236 = fVar234;
                fVar243 = fVar234;
              }
              auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar247 = ZEXT3264(auVar97);
              auVar245 = ZEXT3264(local_920);
              auVar246 = ZEXT3264(local_940);
              auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar165._0_16_,
                                        local_780._0_16_);
              fVar167 = auVar81._0_4_ * 6.0;
              fVar166 = fVar239 * 6.0;
              auVar199._0_4_ = fVar166 * (float)local_820._0_4_;
              auVar199._4_4_ = fVar166 * (float)local_820._4_4_;
              auVar199._8_4_ = fVar166 * fStack_818;
              auVar199._12_4_ = fVar166 * fStack_814;
              auVar175._4_4_ = fVar167;
              auVar175._0_4_ = fVar167;
              auVar175._8_4_ = fVar167;
              auVar175._12_4_ = fVar167;
              auVar81 = vfmadd132ps_fma(auVar175,auVar199,local_7e0._0_16_);
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_780._0_16_,
                                        auVar165._0_16_);
              fVar167 = auVar79._0_4_ * 6.0;
              auVar200._4_4_ = fVar167;
              auVar200._0_4_ = fVar167;
              auVar200._8_4_ = fVar167;
              auVar200._12_4_ = fVar167;
              auVar81 = vfmadd132ps_fma(auVar200,auVar81,local_800._0_16_);
              fVar167 = local_780._0_4_ * 6.0;
              auVar176._4_4_ = fVar167;
              auVar176._0_4_ = fVar167;
              auVar176._8_4_ = fVar167;
              auVar176._12_4_ = fVar167;
              auVar81 = vfmadd132ps_fma(auVar176,auVar81,local_7c0._0_16_);
              auVar201._0_4_ = auVar81._0_4_ * (float)local_850._0_4_;
              auVar201._4_4_ = auVar81._4_4_ * (float)local_850._0_4_;
              auVar201._8_4_ = auVar81._8_4_ * (float)local_850._0_4_;
              auVar201._12_4_ = auVar81._12_4_ * (float)local_850._0_4_;
              auVar81 = vdpps_avx(auVar74,auVar81,0x7f);
              fVar167 = auVar81._0_4_;
              auVar177._0_4_ = auVar74._0_4_ * fVar167;
              auVar177._4_4_ = auVar74._4_4_ * fVar167;
              auVar177._8_4_ = auVar74._8_4_ * fVar167;
              auVar177._12_4_ = auVar74._12_4_ * fVar167;
              auVar81 = vsubps_avx(auVar201,auVar177);
              fVar167 = (float)local_860._0_4_ * (float)local_960._0_4_;
              auVar79 = vmaxss_avx(ZEXT416((uint)fVar225),
                                   ZEXT416((uint)(fVar232 * fVar233 * 1.9073486e-06)));
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar80 = vxorps_avx512vl(auVar74,auVar29);
              auVar202._0_4_ = fVar234 * auVar81._0_4_ * fVar167;
              auVar202._4_4_ = fVar207 * auVar81._4_4_ * fVar167;
              auVar202._8_4_ = fVar236 * auVar81._8_4_ * fVar167;
              auVar202._12_4_ = fVar243 * auVar81._12_4_ * fVar167;
              auVar81 = vdpps_avx(auVar80,auVar151,0x7f);
              auVar82 = vdivss_avx512f(ZEXT416((uint)fVar225),auVar77);
              auVar77 = vfmadd213ss_fma(auVar76,ZEXT416((uint)fVar225),auVar79);
              auVar76 = vdpps_avx(local_9a0._0_16_,auVar202,0x7f);
              vfmadd213ss_avx512f(auVar75,auVar82,auVar77);
              fVar234 = auVar81._0_4_ + auVar76._0_4_;
              auVar76 = vdpps_avx(local_950,auVar151,0x7f);
              auVar77 = vdpps_avx(local_9a0._0_16_,auVar80,0x7f);
              fVar235 = fVar235 * (float)local_870._0_4_ * fVar235 * fVar235 + fVar235 * 1.5;
              auVar81 = vdpps_avx(local_9a0._0_16_,local_950,0x7f);
              auVar75 = vfnmadd231ss_avx512f(auVar77,auVar78,ZEXT416((uint)fVar234));
              auVar80 = vfnmadd231ss_avx512f(auVar81,auVar78,auVar76);
              auVar77 = vpermilps_avx(local_760._0_16_,0xff);
              fVar146 = fVar146 - auVar77._0_4_;
              auVar77 = vshufps_avx(auVar74,auVar74,0xff);
              auVar81 = vfmsub213ss_fma(auVar75,ZEXT416((uint)fVar235),auVar77);
              fVar235 = auVar80._0_4_ * fVar235;
              auVar75 = vfmsub231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar81._0_4_)),
                                        ZEXT416((uint)fVar234),ZEXT416((uint)fVar235));
              fVar207 = auVar75._0_4_;
              auVar231._0_4_ = fVar235 / fVar207;
              auVar231._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar211._0_4_ = auVar81._0_4_ / fVar207;
              auVar211._4_12_ = auVar81._4_12_;
              auVar81 = vmulss_avx512f(auVar78,auVar231);
              auVar75 = vmulss_avx512f(auVar78,auVar211);
              fVar239 = fVar239 - (auVar81._0_4_ - fVar146 * (auVar76._0_4_ / fVar207));
              auVar165 = ZEXT464((uint)fVar239);
              fVar232 = fVar232 - (fVar146 * (fVar234 / fVar207) - auVar75._0_4_);
              auVar219._8_4_ = 0x7fffffff;
              auVar219._0_8_ = 0x7fffffff7fffffff;
              auVar219._12_4_ = 0x7fffffff;
              auVar76 = vandps_avx512vl(auVar78,auVar219);
              auVar76 = vucomiss_avx512f(auVar76);
              in_ZMM31 = ZEXT1664(auVar76);
              bVar69 = true;
              if ((bool)uVar68 || (bool)uVar70) {
LAB_01d1658d:
                auVar220 = ZEXT3264(local_9c0);
              }
              else {
                auVar76 = vaddss_avx512f(auVar79,auVar76);
                auVar78 = vfmadd231ss_fma(auVar76,local_8a0,ZEXT416(0x36000000));
                auVar76 = vandps_avx(ZEXT416((uint)fVar146),auVar219);
                if (auVar78._0_4_ <= auVar76._0_4_) goto LAB_01d1658d;
                fVar232 = fVar232 + (float)local_890._0_4_;
                auVar220 = ZEXT3264(local_9c0);
                if ((((fVar232 < fVar145) ||
                     (fVar234 = *(float *)(ray + k * 4 + 0x200), fVar234 < fVar232)) ||
                    (fVar239 < 0.0)) || (1.0 < fVar239)) {
LAB_01d16588:
                  bVar69 = false;
                  bVar61 = 0;
                }
                else {
                  auVar51._12_4_ = 0;
                  auVar51._0_12_ = ZEXT812(0);
                  auVar76 = vrsqrt14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)local_8e0._0_4_));
                  fVar146 = auVar76._0_4_;
                  pGVar2 = (context->scene->geometries).items[uVar64].ptr;
                  if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) goto LAB_01d16588;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar61 = true;
                  }
                  else {
                    fVar146 = fVar146 * 1.5 +
                              (float)local_8e0._0_4_ * -0.5 * fVar146 * fVar146 * fVar146;
                    auVar178._0_4_ = local_9a0._0_4_ * fVar146;
                    auVar178._4_4_ = local_9a0._4_4_ * fVar146;
                    auVar178._8_4_ = local_9a0._8_4_ * fVar146;
                    auVar178._12_4_ = local_9a0._12_4_ * fVar146;
                    auVar78 = vfmadd213ps_fma(auVar77,auVar178,auVar74);
                    auVar76 = vshufps_avx(auVar178,auVar178,0xc9);
                    auVar77 = vshufps_avx(auVar74,auVar74,0xc9);
                    auVar179._0_4_ = auVar178._0_4_ * auVar77._0_4_;
                    auVar179._4_4_ = auVar178._4_4_ * auVar77._4_4_;
                    auVar179._8_4_ = auVar178._8_4_ * auVar77._8_4_;
                    auVar179._12_4_ = auVar178._12_4_ * auVar77._12_4_;
                    auVar74 = vfmsub231ps_fma(auVar179,auVar74,auVar76);
                    auVar76 = vshufps_avx(auVar74,auVar74,0xc9);
                    auVar77 = vshufps_avx(auVar78,auVar78,0xc9);
                    auVar74 = vshufps_avx(auVar74,auVar74,0xd2);
                    auVar153._0_4_ = auVar78._0_4_ * auVar74._0_4_;
                    auVar153._4_4_ = auVar78._4_4_ * auVar74._4_4_;
                    auVar153._8_4_ = auVar78._8_4_ * auVar74._8_4_;
                    auVar153._12_4_ = auVar78._12_4_ * auVar74._12_4_;
                    auVar76 = vfmsub231ps_fma(auVar153,auVar76,auVar77);
                    auVar77 = ZEXT416((uint)fVar239);
                    local_340 = vbroadcastss_avx512f(auVar77);
                    auVar213 = vbroadcastss_avx512f(ZEXT416(1));
                    auVar213 = vpermps_avx512f(auVar213,ZEXT1664(auVar76));
                    auVar137 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar137,ZEXT1664(auVar76));
                    local_380 = vbroadcastss_avx512f(auVar76);
                    local_400[0] = (RTCHitN)auVar213[0];
                    local_400[1] = (RTCHitN)auVar213[1];
                    local_400[2] = (RTCHitN)auVar213[2];
                    local_400[3] = (RTCHitN)auVar213[3];
                    local_400[4] = (RTCHitN)auVar213[4];
                    local_400[5] = (RTCHitN)auVar213[5];
                    local_400[6] = (RTCHitN)auVar213[6];
                    local_400[7] = (RTCHitN)auVar213[7];
                    local_400[8] = (RTCHitN)auVar213[8];
                    local_400[9] = (RTCHitN)auVar213[9];
                    local_400[10] = (RTCHitN)auVar213[10];
                    local_400[0xb] = (RTCHitN)auVar213[0xb];
                    local_400[0xc] = (RTCHitN)auVar213[0xc];
                    local_400[0xd] = (RTCHitN)auVar213[0xd];
                    local_400[0xe] = (RTCHitN)auVar213[0xe];
                    local_400[0xf] = (RTCHitN)auVar213[0xf];
                    local_400[0x10] = (RTCHitN)auVar213[0x10];
                    local_400[0x11] = (RTCHitN)auVar213[0x11];
                    local_400[0x12] = (RTCHitN)auVar213[0x12];
                    local_400[0x13] = (RTCHitN)auVar213[0x13];
                    local_400[0x14] = (RTCHitN)auVar213[0x14];
                    local_400[0x15] = (RTCHitN)auVar213[0x15];
                    local_400[0x16] = (RTCHitN)auVar213[0x16];
                    local_400[0x17] = (RTCHitN)auVar213[0x17];
                    local_400[0x18] = (RTCHitN)auVar213[0x18];
                    local_400[0x19] = (RTCHitN)auVar213[0x19];
                    local_400[0x1a] = (RTCHitN)auVar213[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar213[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar213[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar213[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar213[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar213[0x1f];
                    local_400[0x20] = (RTCHitN)auVar213[0x20];
                    local_400[0x21] = (RTCHitN)auVar213[0x21];
                    local_400[0x22] = (RTCHitN)auVar213[0x22];
                    local_400[0x23] = (RTCHitN)auVar213[0x23];
                    local_400[0x24] = (RTCHitN)auVar213[0x24];
                    local_400[0x25] = (RTCHitN)auVar213[0x25];
                    local_400[0x26] = (RTCHitN)auVar213[0x26];
                    local_400[0x27] = (RTCHitN)auVar213[0x27];
                    local_400[0x28] = (RTCHitN)auVar213[0x28];
                    local_400[0x29] = (RTCHitN)auVar213[0x29];
                    local_400[0x2a] = (RTCHitN)auVar213[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar213[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar213[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar213[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar213[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar213[0x2f];
                    local_400[0x30] = (RTCHitN)auVar213[0x30];
                    local_400[0x31] = (RTCHitN)auVar213[0x31];
                    local_400[0x32] = (RTCHitN)auVar213[0x32];
                    local_400[0x33] = (RTCHitN)auVar213[0x33];
                    local_400[0x34] = (RTCHitN)auVar213[0x34];
                    local_400[0x35] = (RTCHitN)auVar213[0x35];
                    local_400[0x36] = (RTCHitN)auVar213[0x36];
                    local_400[0x37] = (RTCHitN)auVar213[0x37];
                    local_400[0x38] = (RTCHitN)auVar213[0x38];
                    local_400[0x39] = (RTCHitN)auVar213[0x39];
                    local_400[0x3a] = (RTCHitN)auVar213[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar213[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar213[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar213[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar213[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar213[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_440._0_8_;
                    uStack_2b8 = local_440._8_8_;
                    uStack_2b0 = local_440._16_8_;
                    uStack_2a8 = local_440._24_8_;
                    uStack_2a0 = local_440._32_8_;
                    uStack_298 = local_440._40_8_;
                    uStack_290 = local_440._48_8_;
                    uStack_288 = local_440._56_8_;
                    auVar213 = vmovdqa64_avx512f(local_480);
                    local_280 = vmovdqa64_avx512f(auVar213);
                    vpcmpeqd_avx2(auVar213._0_32_,auVar213._0_32_);
                    local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar232;
                    local_700 = local_4c0;
                    local_9f0.valid = (int *)local_700;
                    local_9f0.geometryUserPtr = pGVar2->userPtr;
                    local_9f0.context = context->user;
                    local_9f0.hit = local_400;
                    local_9f0.N = 0x10;
                    local_9f0.ray = (RTCRayN *)ray;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar2->occlusionFilterN)(&local_9f0);
                      auVar165 = ZEXT1664(auVar77);
                      auVar246 = ZEXT3264(local_940);
                      auVar245 = ZEXT3264(local_920);
                      auVar220 = ZEXT3264(local_9c0);
                      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar247 = ZEXT3264(auVar97);
                    }
                    auVar213 = vmovdqa64_avx512f(local_700);
                    uVar20 = vptestmd_avx512f(auVar213,auVar213);
                    if ((short)uVar20 == 0) {
                      bVar61 = false;
                    }
                    else {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var3)(&local_9f0);
                        auVar165 = ZEXT1664(auVar77);
                        auVar246 = ZEXT3264(local_940);
                        auVar245 = ZEXT3264(local_920);
                        auVar220 = ZEXT3264(local_9c0);
                        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar247 = ZEXT3264(auVar97);
                      }
                      auVar213 = vmovdqa64_avx512f(local_700);
                      uVar72 = vptestmd_avx512f(auVar213,auVar213);
                      auVar213 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      bVar69 = (bool)((byte)uVar72 & 1);
                      auVar137._0_4_ =
                           (uint)bVar69 * auVar213._0_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x200);
                      bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
                      auVar137._4_4_ =
                           (uint)bVar69 * auVar213._4_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x204);
                      bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
                      auVar137._8_4_ =
                           (uint)bVar69 * auVar213._8_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x208);
                      bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
                      auVar137._12_4_ =
                           (uint)bVar69 * auVar213._12_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x20c);
                      bVar69 = (bool)((byte)(uVar72 >> 4) & 1);
                      auVar137._16_4_ =
                           (uint)bVar69 * auVar213._16_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x210);
                      bVar69 = (bool)((byte)(uVar72 >> 5) & 1);
                      auVar137._20_4_ =
                           (uint)bVar69 * auVar213._20_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x214);
                      bVar69 = (bool)((byte)(uVar72 >> 6) & 1);
                      auVar137._24_4_ =
                           (uint)bVar69 * auVar213._24_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x218);
                      bVar69 = (bool)((byte)(uVar72 >> 7) & 1);
                      auVar137._28_4_ =
                           (uint)bVar69 * auVar213._28_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x21c);
                      bVar69 = (bool)((byte)(uVar72 >> 8) & 1);
                      auVar137._32_4_ =
                           (uint)bVar69 * auVar213._32_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x220);
                      bVar69 = (bool)((byte)(uVar72 >> 9) & 1);
                      auVar137._36_4_ =
                           (uint)bVar69 * auVar213._36_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x224);
                      bVar69 = (bool)((byte)(uVar72 >> 10) & 1);
                      auVar137._40_4_ =
                           (uint)bVar69 * auVar213._40_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x228);
                      bVar69 = (bool)((byte)(uVar72 >> 0xb) & 1);
                      auVar137._44_4_ =
                           (uint)bVar69 * auVar213._44_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x22c);
                      bVar69 = (bool)((byte)(uVar72 >> 0xc) & 1);
                      auVar137._48_4_ =
                           (uint)bVar69 * auVar213._48_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x230);
                      bVar69 = (bool)((byte)(uVar72 >> 0xd) & 1);
                      auVar137._52_4_ =
                           (uint)bVar69 * auVar213._52_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x234);
                      bVar69 = (bool)((byte)(uVar72 >> 0xe) & 1);
                      auVar137._56_4_ =
                           (uint)bVar69 * auVar213._56_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x238);
                      bVar69 = SUB81(uVar72 >> 0xf,0);
                      auVar137._60_4_ =
                           (uint)bVar69 * auVar213._60_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x23c);
                      *(undefined1 (*) [64])(local_9f0.ray + 0x200) = auVar137;
                      bVar61 = (short)uVar72 != 0;
                    }
                    if ((bool)bVar61 == false) {
                      *(float *)(ray + k * 4 + 0x200) = fVar234;
                    }
                  }
                  bVar69 = false;
                }
              }
              if (!bVar69) goto LAB_01d169d4;
              lVar67 = lVar67 + -1;
            } while (lVar67 != 0);
            bVar61 = 0;
LAB_01d169d4:
            bVar58 = bVar58 | bVar61 & 1;
            auVar53._4_4_ = fStack_67c;
            auVar53._0_4_ = local_680;
            auVar53._8_4_ = fStack_678;
            auVar53._12_4_ = fStack_674;
            auVar53._16_4_ = fStack_670;
            auVar53._20_4_ = fStack_66c;
            auVar53._24_4_ = fStack_668;
            auVar53._28_4_ = fStack_664;
            uVar224 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar38._4_4_ = uVar224;
            auVar38._0_4_ = uVar224;
            auVar38._8_4_ = uVar224;
            auVar38._12_4_ = uVar224;
            auVar38._16_4_ = uVar224;
            auVar38._20_4_ = uVar224;
            auVar38._24_4_ = uVar224;
            auVar38._28_4_ = uVar224;
            uVar20 = vcmpps_avx512vl(auVar53,auVar38,2);
            bVar62 = bVar63 & bVar62 & (byte)uVar20;
          } while (bVar62 != 0);
        }
        uVar22 = vpcmpd_avx512vl(local_620,_local_6a0,1);
        uVar21 = vpcmpd_avx512vl(local_620,local_5a0,1);
        auVar184._0_4_ = (float)local_720._0_4_ + (float)local_500._0_4_;
        auVar184._4_4_ = (float)local_720._4_4_ + (float)local_500._4_4_;
        auVar184._8_4_ = fStack_718 + fStack_4f8;
        auVar184._12_4_ = fStack_714 + fStack_4f4;
        auVar184._16_4_ = fStack_710 + fStack_4f0;
        auVar184._20_4_ = fStack_70c + fStack_4ec;
        auVar184._24_4_ = fStack_708 + fStack_4e8;
        auVar184._28_4_ = fStack_704 + fStack_4e4;
        uVar224 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar206._4_4_ = uVar224;
        auVar206._0_4_ = uVar224;
        auVar206._8_4_ = uVar224;
        auVar206._12_4_ = uVar224;
        auVar206._16_4_ = uVar224;
        auVar206._20_4_ = uVar224;
        auVar206._24_4_ = uVar224;
        auVar206._28_4_ = uVar224;
        uVar20 = vcmpps_avx512vl(auVar184,auVar206,2);
        bVar56 = bVar56 & (byte)uVar21 & (byte)uVar20;
        auVar212._0_4_ = (float)local_720._0_4_ + local_5e0._0_4_;
        auVar212._4_4_ = (float)local_720._4_4_ + local_5e0._4_4_;
        auVar212._8_4_ = fStack_718 + local_5e0._8_4_;
        auVar212._12_4_ = fStack_714 + local_5e0._12_4_;
        auVar212._16_4_ = fStack_710 + local_5e0._16_4_;
        auVar212._20_4_ = fStack_70c + local_5e0._20_4_;
        auVar212._24_4_ = fStack_708 + local_5e0._24_4_;
        auVar212._28_4_ = fStack_704 + local_5e0._28_4_;
        uVar20 = vcmpps_avx512vl(auVar212,auVar206,2);
        bVar59 = bVar59 & (byte)uVar22 & (byte)uVar20 | bVar56;
        if (bVar59 == 0) {
          auVar213 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          auVar165 = ZEXT3264(local_840);
        }
        else {
          local_1a0[uVar57 * 0x60] = bVar59;
          auVar135._0_4_ =
               (uint)(bVar56 & 1) * local_500._0_4_ |
               (uint)!(bool)(bVar56 & 1) * (int)local_5e0._0_4_;
          bVar69 = (bool)(bVar56 >> 1 & 1);
          auVar135._4_4_ = (uint)bVar69 * local_500._4_4_ | (uint)!bVar69 * (int)local_5e0._4_4_;
          bVar69 = (bool)(bVar56 >> 2 & 1);
          auVar135._8_4_ = (uint)bVar69 * (int)fStack_4f8 | (uint)!bVar69 * (int)local_5e0._8_4_;
          bVar69 = (bool)(bVar56 >> 3 & 1);
          auVar135._12_4_ = (uint)bVar69 * (int)fStack_4f4 | (uint)!bVar69 * (int)local_5e0._12_4_;
          bVar69 = (bool)(bVar56 >> 4 & 1);
          auVar135._16_4_ = (uint)bVar69 * (int)fStack_4f0 | (uint)!bVar69 * (int)local_5e0._16_4_;
          bVar69 = (bool)(bVar56 >> 5 & 1);
          auVar135._20_4_ = (uint)bVar69 * (int)fStack_4ec | (uint)!bVar69 * (int)local_5e0._20_4_;
          auVar135._24_4_ =
               (uint)(bVar56 >> 6) * (int)fStack_4e8 |
               (uint)!(bool)(bVar56 >> 6) * (int)local_5e0._24_4_;
          auVar135._28_4_ = local_5e0._28_4_;
          *(undefined1 (*) [32])(auStack_180 + uVar57 * 0x60) = auVar135;
          uVar20 = vmovlps_avx(local_8b0);
          *(undefined8 *)(local_160 + uVar57 * 0x18) = uVar20;
          local_158[uVar57 * 0x18] = iVar66 + 1;
          auVar213 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          auVar165 = ZEXT3264(local_840);
          uVar57 = (ulong)((int)uVar57 + 1);
        }
      }
    }
    do {
      if ((int)uVar57 == 0) {
        if (bVar58 != 0) {
          return bVar71;
        }
        uVar224 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar40._4_4_ = uVar224;
        auVar40._0_4_ = uVar224;
        auVar40._8_4_ = uVar224;
        auVar40._12_4_ = uVar224;
        auVar40._16_4_ = uVar224;
        auVar40._20_4_ = uVar224;
        auVar40._24_4_ = uVar224;
        auVar40._28_4_ = uVar224;
        uVar20 = vcmpps_avx512vl(local_580,auVar40,2);
        uVar64 = (uint)uVar65 & (uint)uVar20;
        uVar65 = (ulong)uVar64;
        bVar71 = uVar64 != 0;
        if (!bVar71) {
          return bVar71;
        }
        goto LAB_01d143da;
      }
      uVar60 = (ulong)((int)uVar57 - 1);
      lVar67 = uVar60 * 0x60;
      auVar97 = *(undefined1 (*) [32])(auStack_180 + lVar67);
      auVar185._0_4_ = auVar97._0_4_ + (float)local_720._0_4_;
      auVar185._4_4_ = auVar97._4_4_ + (float)local_720._4_4_;
      auVar185._8_4_ = auVar97._8_4_ + fStack_718;
      auVar185._12_4_ = auVar97._12_4_ + fStack_714;
      auVar185._16_4_ = auVar97._16_4_ + fStack_710;
      auVar185._20_4_ = auVar97._20_4_ + fStack_70c;
      auVar185._24_4_ = auVar97._24_4_ + fStack_708;
      auVar185._28_4_ = auVar97._28_4_ + fStack_704;
      uVar224 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar39._4_4_ = uVar224;
      auVar39._0_4_ = uVar224;
      auVar39._8_4_ = uVar224;
      auVar39._12_4_ = uVar224;
      auVar39._16_4_ = uVar224;
      auVar39._20_4_ = uVar224;
      auVar39._24_4_ = uVar224;
      auVar39._28_4_ = uVar224;
      uVar20 = vcmpps_avx512vl(auVar185,auVar39,2);
      uVar73 = (uint)uVar20 & (uint)local_1a0[lVar67];
      bVar59 = (byte)uVar73;
      uVar72 = uVar60;
      if (uVar73 != 0) {
        auVar186._8_4_ = 0x7f800000;
        auVar186._0_8_ = 0x7f8000007f800000;
        auVar186._12_4_ = 0x7f800000;
        auVar186._16_4_ = 0x7f800000;
        auVar186._20_4_ = 0x7f800000;
        auVar186._24_4_ = 0x7f800000;
        auVar186._28_4_ = 0x7f800000;
        auVar83 = vblendmps_avx512vl(auVar186,auVar97);
        auVar136._0_4_ =
             (uint)(bVar59 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar59 & 1) * (int)auVar97._0_4_;
        bVar69 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar136._4_4_ = (uint)bVar69 * auVar83._4_4_ | (uint)!bVar69 * (int)auVar97._4_4_;
        bVar69 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar136._8_4_ = (uint)bVar69 * auVar83._8_4_ | (uint)!bVar69 * (int)auVar97._8_4_;
        bVar69 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar136._12_4_ = (uint)bVar69 * auVar83._12_4_ | (uint)!bVar69 * (int)auVar97._12_4_;
        bVar69 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar136._16_4_ = (uint)bVar69 * auVar83._16_4_ | (uint)!bVar69 * (int)auVar97._16_4_;
        bVar69 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar136._20_4_ = (uint)bVar69 * auVar83._20_4_ | (uint)!bVar69 * (int)auVar97._20_4_;
        bVar69 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar136._24_4_ = (uint)bVar69 * auVar83._24_4_ | (uint)!bVar69 * (int)auVar97._24_4_;
        auVar136._28_4_ =
             (uVar73 >> 7) * auVar83._28_4_ | (uint)!SUB41(uVar73 >> 7,0) * (int)auVar97._28_4_;
        auVar97 = vshufps_avx(auVar136,auVar136,0xb1);
        auVar97 = vminps_avx(auVar136,auVar97);
        auVar83 = vshufpd_avx(auVar97,auVar97,5);
        auVar97 = vminps_avx(auVar97,auVar83);
        auVar83 = vpermpd_avx2(auVar97,0x4e);
        auVar97 = vminps_avx(auVar97,auVar83);
        uVar20 = vcmpps_avx512vl(auVar136,auVar97,0);
        bVar62 = (byte)uVar20 & bVar59;
        if (bVar62 != 0) {
          uVar73 = (uint)bVar62;
        }
        fVar225 = local_160[uVar60 * 0x18 + 1];
        uVar138 = 0;
        for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
          uVar138 = uVar138 + 1;
        }
        iVar66 = local_158[uVar60 * 0x18];
        bVar62 = ~('\x01' << ((byte)uVar138 & 0x1f)) & bVar59;
        local_1a0[lVar67] = bVar62;
        auVar165 = ZEXT3264(local_840);
        if (bVar62 != 0) {
          uVar72 = uVar57;
        }
        fVar232 = local_160[uVar60 * 0x18];
        auVar187._4_4_ = fVar232;
        auVar187._0_4_ = fVar232;
        auVar187._8_4_ = fVar232;
        auVar187._12_4_ = fVar232;
        auVar187._16_4_ = fVar232;
        auVar187._20_4_ = fVar232;
        auVar187._24_4_ = fVar232;
        auVar187._28_4_ = fVar232;
        fVar225 = fVar225 - fVar232;
        auVar164._4_4_ = fVar225;
        auVar164._0_4_ = fVar225;
        auVar164._8_4_ = fVar225;
        auVar164._12_4_ = fVar225;
        auVar164._16_4_ = fVar225;
        auVar164._20_4_ = fVar225;
        auVar164._24_4_ = fVar225;
        auVar164._28_4_ = fVar225;
        auVar76 = vfmadd132ps_fma(auVar164,auVar187,_DAT_02020f20);
        auVar97 = ZEXT1632(auVar76);
        local_400[0] = (RTCHitN)auVar97[0];
        local_400[1] = (RTCHitN)auVar97[1];
        local_400[2] = (RTCHitN)auVar97[2];
        local_400[3] = (RTCHitN)auVar97[3];
        local_400[4] = (RTCHitN)auVar97[4];
        local_400[5] = (RTCHitN)auVar97[5];
        local_400[6] = (RTCHitN)auVar97[6];
        local_400[7] = (RTCHitN)auVar97[7];
        local_400[8] = (RTCHitN)auVar97[8];
        local_400[9] = (RTCHitN)auVar97[9];
        local_400[10] = (RTCHitN)auVar97[10];
        local_400[0xb] = (RTCHitN)auVar97[0xb];
        local_400[0xc] = (RTCHitN)auVar97[0xc];
        local_400[0xd] = (RTCHitN)auVar97[0xd];
        local_400[0xe] = (RTCHitN)auVar97[0xe];
        local_400[0xf] = (RTCHitN)auVar97[0xf];
        local_400[0x10] = (RTCHitN)auVar97[0x10];
        local_400[0x11] = (RTCHitN)auVar97[0x11];
        local_400[0x12] = (RTCHitN)auVar97[0x12];
        local_400[0x13] = (RTCHitN)auVar97[0x13];
        local_400[0x14] = (RTCHitN)auVar97[0x14];
        local_400[0x15] = (RTCHitN)auVar97[0x15];
        local_400[0x16] = (RTCHitN)auVar97[0x16];
        local_400[0x17] = (RTCHitN)auVar97[0x17];
        local_400[0x18] = (RTCHitN)auVar97[0x18];
        local_400[0x19] = (RTCHitN)auVar97[0x19];
        local_400[0x1a] = (RTCHitN)auVar97[0x1a];
        local_400[0x1b] = (RTCHitN)auVar97[0x1b];
        local_400[0x1c] = (RTCHitN)auVar97[0x1c];
        local_400[0x1d] = (RTCHitN)auVar97[0x1d];
        local_400[0x1e] = (RTCHitN)auVar97[0x1e];
        local_400[0x1f] = (RTCHitN)auVar97[0x1f];
        local_8b0._8_8_ = 0;
        local_8b0._0_8_ = *(ulong *)(local_400 + (ulong)uVar138 * 4);
      }
      uVar57 = uVar72;
    } while (bVar59 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }